

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [12];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  uint uVar56;
  byte bVar57;
  ulong uVar58;
  long lVar59;
  uint uVar60;
  uint uVar61;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ulong uVar62;
  bool bVar63;
  byte bVar64;
  uint uVar65;
  undefined1 uVar66;
  bool bVar67;
  undefined1 uVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar80 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  uint uVar140;
  float pp;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar220 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 extraout_var [60];
  undefined1 auVar154 [64];
  float fVar155;
  undefined4 uVar156;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar164 [32];
  undefined1 auVar157 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [32];
  undefined1 auVar207 [16];
  undefined1 auVar214 [32];
  undefined1 auVar212 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar232 [32];
  undefined1 auVar229 [16];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [28];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar249;
  undefined1 auVar248 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_ad8;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  Primitive *local_6d0;
  ulong local_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  RTCHitN local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var_00 [60];
  
  PVar1 = prim[1];
  uVar58 = (ulong)(byte)PVar1;
  fVar202 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar79 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar225 = vsubps_avx(auVar73,*(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  fVar201 = fVar202 * auVar225._0_4_;
  fVar141 = fVar202 * auVar79._0_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar58 * 4 + 6);
  auVar86 = vpmovsxbd_avx2(auVar73);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar58 * 5 + 6);
  auVar84 = vpmovsxbd_avx2(auVar12);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar58 * 6 + 6);
  auVar87 = vpmovsxbd_avx2(auVar74);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar88 = vpmovsxbd_avx2(auVar75);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar93 = vpmovsxbd_avx2(auVar71);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar93);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar58 + 6);
  auVar85 = vpmovsxbd_avx2(auVar76);
  auVar85 = vcvtdq2ps_avx(auVar85);
  uVar69 = (ulong)(uint)((int)(uVar58 * 9) * 2);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar90 = vpmovsxbd_avx2(auVar77);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar69 + uVar58 + 6);
  auVar91 = vpmovsxbd_avx2(auVar72);
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar62 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar62 + 6);
  auVar83 = vpmovsxbd_avx2(auVar78);
  auVar92 = vcvtdq2ps_avx(auVar83);
  auVar103._4_4_ = fVar141;
  auVar103._0_4_ = fVar141;
  auVar103._8_4_ = fVar141;
  auVar103._12_4_ = fVar141;
  auVar103._16_4_ = fVar141;
  auVar103._20_4_ = fVar141;
  auVar103._24_4_ = fVar141;
  auVar103._28_4_ = fVar141;
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = ZEXT1632(CONCAT412(fVar202 * auVar79._12_4_,
                               CONCAT48(fVar202 * auVar79._8_4_,
                                        CONCAT44(fVar202 * auVar79._4_4_,fVar141))));
  auVar94 = vpermps_avx2(auVar105,auVar95);
  auVar82 = vpermps_avx512vl(auVar81,auVar95);
  fVar141 = auVar82._0_4_;
  fVar155 = auVar82._4_4_;
  auVar95._4_4_ = fVar155 * auVar87._4_4_;
  auVar95._0_4_ = fVar141 * auVar87._0_4_;
  fVar168 = auVar82._8_4_;
  auVar95._8_4_ = fVar168 * auVar87._8_4_;
  fVar169 = auVar82._12_4_;
  auVar95._12_4_ = fVar169 * auVar87._12_4_;
  fVar170 = auVar82._16_4_;
  auVar95._16_4_ = fVar170 * auVar87._16_4_;
  fVar172 = auVar82._20_4_;
  auVar95._20_4_ = fVar172 * auVar87._20_4_;
  fVar171 = auVar82._24_4_;
  auVar95._24_4_ = fVar171 * auVar87._24_4_;
  auVar95._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar85._4_4_ * fVar155;
  auVar93._0_4_ = auVar85._0_4_ * fVar141;
  auVar93._8_4_ = auVar85._8_4_ * fVar168;
  auVar93._12_4_ = auVar85._12_4_ * fVar169;
  auVar93._16_4_ = auVar85._16_4_ * fVar170;
  auVar93._20_4_ = auVar85._20_4_ * fVar172;
  auVar93._24_4_ = auVar85._24_4_ * fVar171;
  auVar93._28_4_ = auVar83._28_4_;
  auVar83._4_4_ = auVar92._4_4_ * fVar155;
  auVar83._0_4_ = auVar92._0_4_ * fVar141;
  auVar83._8_4_ = auVar92._8_4_ * fVar168;
  auVar83._12_4_ = auVar92._12_4_ * fVar169;
  auVar83._16_4_ = auVar92._16_4_ * fVar170;
  auVar83._20_4_ = auVar92._20_4_ * fVar172;
  auVar83._24_4_ = auVar92._24_4_ * fVar171;
  auVar83._28_4_ = auVar82._28_4_;
  auVar73 = vfmadd231ps_fma(auVar95,auVar94,auVar84);
  auVar12 = vfmadd231ps_fma(auVar93,auVar94,auVar89);
  auVar74 = vfmadd231ps_fma(auVar83,auVar91,auVar94);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar103,auVar86);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar103,auVar88);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar90,auVar103);
  auVar104._4_4_ = fVar201;
  auVar104._0_4_ = fVar201;
  auVar104._8_4_ = fVar201;
  auVar104._12_4_ = fVar201;
  auVar104._16_4_ = fVar201;
  auVar104._20_4_ = fVar201;
  auVar104._24_4_ = fVar201;
  auVar104._28_4_ = fVar201;
  auVar83 = ZEXT1632(CONCAT412(fVar202 * auVar225._12_4_,
                               CONCAT48(fVar202 * auVar225._8_4_,
                                        CONCAT44(fVar202 * auVar225._4_4_,fVar201))));
  auVar93 = vpermps_avx2(auVar105,auVar83);
  auVar83 = vpermps_avx512vl(auVar81,auVar83);
  fVar202 = auVar83._0_4_;
  fVar141 = auVar83._4_4_;
  auVar94._4_4_ = fVar141 * auVar87._4_4_;
  auVar94._0_4_ = fVar202 * auVar87._0_4_;
  fVar155 = auVar83._8_4_;
  auVar94._8_4_ = fVar155 * auVar87._8_4_;
  fVar168 = auVar83._12_4_;
  auVar94._12_4_ = fVar168 * auVar87._12_4_;
  fVar169 = auVar83._16_4_;
  auVar94._16_4_ = fVar169 * auVar87._16_4_;
  fVar170 = auVar83._20_4_;
  auVar94._20_4_ = fVar170 * auVar87._20_4_;
  fVar172 = auVar83._24_4_;
  auVar94._24_4_ = fVar172 * auVar87._24_4_;
  auVar94._28_4_ = 1;
  auVar81._4_4_ = auVar85._4_4_ * fVar141;
  auVar81._0_4_ = auVar85._0_4_ * fVar202;
  auVar81._8_4_ = auVar85._8_4_ * fVar155;
  auVar81._12_4_ = auVar85._12_4_ * fVar168;
  auVar81._16_4_ = auVar85._16_4_ * fVar169;
  auVar81._20_4_ = auVar85._20_4_ * fVar170;
  auVar81._24_4_ = auVar85._24_4_ * fVar172;
  auVar81._28_4_ = auVar87._28_4_;
  auVar85._4_4_ = auVar92._4_4_ * fVar141;
  auVar85._0_4_ = auVar92._0_4_ * fVar202;
  auVar85._8_4_ = auVar92._8_4_ * fVar155;
  auVar85._12_4_ = auVar92._12_4_ * fVar168;
  auVar85._16_4_ = auVar92._16_4_ * fVar169;
  auVar85._20_4_ = auVar92._20_4_ * fVar170;
  auVar85._24_4_ = auVar92._24_4_ * fVar172;
  auVar85._28_4_ = auVar83._28_4_;
  auVar75 = vfmadd231ps_fma(auVar94,auVar93,auVar84);
  auVar71 = vfmadd231ps_fma(auVar81,auVar93,auVar89);
  auVar76 = vfmadd231ps_fma(auVar85,auVar93,auVar91);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar104,auVar86);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar104,auVar88);
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar104,auVar90);
  auVar86 = vandps_avx(ZEXT1632(auVar73),auVar100);
  auVar102._8_4_ = 0x219392ef;
  auVar102._0_8_ = 0x219392ef219392ef;
  auVar102._12_4_ = 0x219392ef;
  auVar102._16_4_ = 0x219392ef;
  auVar102._20_4_ = 0x219392ef;
  auVar102._24_4_ = 0x219392ef;
  auVar102._28_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar86,auVar102,1);
  bVar63 = (bool)((byte)uVar69 & 1);
  auVar82._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._0_4_;
  bVar63 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._4_4_;
  bVar63 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._8_4_;
  bVar63 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar12),auVar100);
  uVar69 = vcmpps_avx512vl(auVar86,auVar102,1);
  bVar63 = (bool)((byte)uVar69 & 1);
  auVar96._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar12._0_4_;
  bVar63 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar12._4_4_;
  bVar63 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar12._8_4_;
  bVar63 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar12._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar74),auVar100);
  uVar69 = vcmpps_avx512vl(auVar86,auVar102,1);
  bVar63 = (bool)((byte)uVar69 & 1);
  auVar86._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar74._0_4_;
  bVar63 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar74._4_4_;
  bVar63 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar74._8_4_;
  bVar63 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar74._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar69 >> 7) * 0x219392ef;
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar73 = vfnmadd213ps_fma(auVar82,auVar84,auVar101);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar96);
  auVar12 = vfnmadd213ps_fma(auVar96,auVar84,auVar101);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar86);
  auVar74 = vfnmadd213ps_fma(auVar86,auVar84,auVar101);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar84,auVar84);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 7 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar75));
  auVar90._4_4_ = auVar73._4_4_ * auVar86._4_4_;
  auVar90._0_4_ = auVar73._0_4_ * auVar86._0_4_;
  auVar90._8_4_ = auVar73._8_4_ * auVar86._8_4_;
  auVar90._12_4_ = auVar73._12_4_ * auVar86._12_4_;
  auVar90._16_4_ = auVar86._16_4_ * 0.0;
  auVar90._20_4_ = auVar86._20_4_ * 0.0;
  auVar90._24_4_ = auVar86._24_4_ * 0.0;
  auVar90._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 9 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar75));
  auVar85 = vpbroadcastd_avx512vl();
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar99._0_4_ = auVar73._0_4_ * auVar86._0_4_;
  auVar99._4_4_ = auVar73._4_4_ * auVar86._4_4_;
  auVar99._8_4_ = auVar73._8_4_ * auVar86._8_4_;
  auVar99._12_4_ = auVar73._12_4_ * auVar86._12_4_;
  auVar99._16_4_ = auVar86._16_4_ * 0.0;
  auVar99._20_4_ = auVar86._20_4_ * 0.0;
  auVar99._24_4_ = auVar86._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar1 * 0x10 + uVar58 * -2 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar71));
  auVar91._4_4_ = auVar12._4_4_ * auVar86._4_4_;
  auVar91._0_4_ = auVar12._0_4_ * auVar86._0_4_;
  auVar91._8_4_ = auVar12._8_4_ * auVar86._8_4_;
  auVar91._12_4_ = auVar12._12_4_ * auVar86._12_4_;
  auVar91._16_4_ = auVar86._16_4_ * 0.0;
  auVar91._20_4_ = auVar86._20_4_ * 0.0;
  auVar91._24_4_ = auVar86._24_4_ * 0.0;
  auVar91._28_4_ = auVar86._28_4_;
  auVar86 = vcvtdq2ps_avx(auVar84);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar71));
  auVar98._0_4_ = auVar12._0_4_ * auVar86._0_4_;
  auVar98._4_4_ = auVar12._4_4_ * auVar86._4_4_;
  auVar98._8_4_ = auVar12._8_4_ * auVar86._8_4_;
  auVar98._12_4_ = auVar12._12_4_ * auVar86._12_4_;
  auVar98._16_4_ = auVar86._16_4_ * 0.0;
  auVar98._20_4_ = auVar86._20_4_ * 0.0;
  auVar98._24_4_ = auVar86._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar62 + uVar58 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar76));
  auVar92._4_4_ = auVar86._4_4_ * auVar74._4_4_;
  auVar92._0_4_ = auVar86._0_4_ * auVar74._0_4_;
  auVar92._8_4_ = auVar86._8_4_ * auVar74._8_4_;
  auVar92._12_4_ = auVar86._12_4_ * auVar74._12_4_;
  auVar92._16_4_ = auVar86._16_4_ * 0.0;
  auVar92._20_4_ = auVar86._20_4_ * 0.0;
  auVar92._24_4_ = auVar86._24_4_ * 0.0;
  auVar92._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 0x17 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar76));
  auVar97._0_4_ = auVar74._0_4_ * auVar86._0_4_;
  auVar97._4_4_ = auVar74._4_4_ * auVar86._4_4_;
  auVar97._8_4_ = auVar74._8_4_ * auVar86._8_4_;
  auVar97._12_4_ = auVar74._12_4_ * auVar86._12_4_;
  auVar97._16_4_ = auVar86._16_4_ * 0.0;
  auVar97._20_4_ = auVar86._20_4_ * 0.0;
  auVar97._24_4_ = auVar86._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar86 = vpminsd_avx2(auVar90,auVar99);
  auVar84 = vpminsd_avx2(auVar91,auVar98);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84 = vpminsd_avx2(auVar92,auVar97);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar87._4_4_ = uVar156;
  auVar87._0_4_ = uVar156;
  auVar87._8_4_ = uVar156;
  auVar87._12_4_ = uVar156;
  auVar87._16_4_ = uVar156;
  auVar87._20_4_ = uVar156;
  auVar87._24_4_ = uVar156;
  auVar87._28_4_ = uVar156;
  auVar84 = vmaxps_avx512vl(auVar84,auVar87);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  auVar84._16_4_ = 0x3f7ffffa;
  auVar84._20_4_ = 0x3f7ffffa;
  auVar84._24_4_ = 0x3f7ffffa;
  auVar84._28_4_ = 0x3f7ffffa;
  local_2a0 = vmulps_avx512vl(auVar86,auVar84);
  auVar86 = vpmaxsd_avx2(auVar90,auVar99);
  auVar84 = vpmaxsd_avx2(auVar91,auVar98);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar84 = vpmaxsd_avx2(auVar92,auVar97);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar88._4_4_ = uVar156;
  auVar88._0_4_ = uVar156;
  auVar88._8_4_ = uVar156;
  auVar88._12_4_ = uVar156;
  auVar88._16_4_ = uVar156;
  auVar88._20_4_ = uVar156;
  auVar88._24_4_ = uVar156;
  auVar88._28_4_ = uVar156;
  auVar84 = vminps_avx512vl(auVar84,auVar88);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar89._16_4_ = 0x3f800003;
  auVar89._20_4_ = 0x3f800003;
  auVar89._24_4_ = 0x3f800003;
  auVar89._28_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar89);
  uVar15 = vpcmpgtd_avx512vl(auVar85,_DAT_01fe9900);
  uVar14 = vcmpps_avx512vl(local_2a0,auVar86,2);
  if ((byte)((byte)uVar14 & (byte)uVar15) == 0) {
    return false;
  }
  local_6c8 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  local_4c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6d0 = prim;
LAB_01d4d8bd:
  lVar59 = 0;
  for (uVar69 = local_6c8; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    lVar59 = lVar59 + 1;
  }
  uVar65 = *(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[uVar65].ptr;
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar59 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar59 = *(long *)&pGVar2[1].time_range.upper;
  auVar73 = *(undefined1 (*) [16])(lVar59 + (long)p_Var3 * uVar69);
  auVar12 = *(undefined1 (*) [16])(lVar59 + (uVar69 + 1) * (long)p_Var3);
  auVar74 = *(undefined1 (*) [16])(lVar59 + (uVar69 + 2) * (long)p_Var3);
  local_6c8 = local_6c8 - 1 & local_6c8;
  auVar75 = *(undefined1 (*) [16])(lVar59 + (uVar69 + 3) * (long)p_Var3);
  if (local_6c8 != 0) {
    uVar62 = local_6c8 - 1 & local_6c8;
    for (uVar69 = local_6c8; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
    }
    if (uVar62 != 0) {
      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar71 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar76 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  _local_520 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar71 = vunpcklps_avx512vl(local_520._0_16_,local_540._0_16_);
  local_620 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar78 = local_620._0_16_;
  local_7b0 = vinsertps_avx512f(auVar71,auVar78,0x28);
  auVar225._0_4_ = auVar73._0_4_ + auVar12._0_4_ + auVar74._0_4_ + auVar75._0_4_;
  auVar225._4_4_ = auVar73._4_4_ + auVar12._4_4_ + auVar74._4_4_ + auVar75._4_4_;
  auVar225._8_4_ = auVar73._8_4_ + auVar12._8_4_ + auVar74._8_4_ + auVar75._8_4_;
  auVar225._12_4_ = auVar73._12_4_ + auVar12._12_4_ + auVar74._12_4_ + auVar75._12_4_;
  auVar79._8_4_ = 0x3e800000;
  auVar79._0_8_ = 0x3e8000003e800000;
  auVar79._12_4_ = 0x3e800000;
  auVar71 = vmulps_avx512vl(auVar225,auVar79);
  auVar71 = vsubps_avx(auVar71,auVar76);
  auVar71 = vdpps_avx(auVar71,local_7b0,0x7f);
  fVar202 = *(float *)(ray + k * 4 + 0x60);
  local_7c0 = vdpps_avx(local_7b0,local_7b0,0x7f);
  auVar234._4_12_ = ZEXT812(0) << 0x20;
  auVar234._0_4_ = local_7c0._0_4_;
  auVar72 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar234);
  auVar77 = vfnmadd213ss_fma(auVar72,local_7c0,ZEXT416(0x40000000));
  fVar141 = auVar71._0_4_ * auVar72._0_4_ * auVar77._0_4_;
  auVar80._4_4_ = fVar141;
  auVar80._0_4_ = fVar141;
  auVar80._8_4_ = fVar141;
  auVar80._12_4_ = fVar141;
  auVar71 = vfmadd231ps_fma(auVar76,local_7b0,auVar80);
  auVar71 = vblendps_avx(auVar71,ZEXT816(0) << 0x40,8);
  auVar73 = vsubps_avx(auVar73,auVar71);
  auVar74 = vsubps_avx(auVar74,auVar71);
  auVar12 = vsubps_avx(auVar12,auVar71);
  auVar75 = vsubps_avx(auVar75,auVar71);
  uVar156 = auVar73._0_4_;
  auVar244._4_4_ = uVar156;
  auVar244._0_4_ = uVar156;
  auVar244._8_4_ = uVar156;
  auVar244._12_4_ = uVar156;
  auVar244._16_4_ = uVar156;
  auVar244._20_4_ = uVar156;
  auVar244._24_4_ = uVar156;
  auVar244._28_4_ = uVar156;
  auVar107._8_4_ = 1;
  auVar107._0_8_ = 0x100000001;
  auVar107._12_4_ = 1;
  auVar107._16_4_ = 1;
  auVar107._20_4_ = 1;
  auVar107._24_4_ = 1;
  auVar107._28_4_ = 1;
  local_640 = ZEXT1632(auVar73);
  auVar86 = vpermps_avx2(auVar107,local_640);
  auVar108._8_4_ = 2;
  auVar108._0_8_ = 0x200000002;
  auVar108._12_4_ = 2;
  auVar108._16_4_ = 2;
  auVar108._20_4_ = 2;
  auVar108._24_4_ = 2;
  auVar108._28_4_ = 2;
  auVar84 = vpermps_avx2(auVar108,local_640);
  auVar109._8_4_ = 3;
  auVar109._0_8_ = 0x300000003;
  auVar109._12_4_ = 3;
  auVar109._16_4_ = 3;
  auVar109._20_4_ = 3;
  auVar109._24_4_ = 3;
  auVar109._28_4_ = 3;
  auVar87 = vpermps_avx512vl(auVar109,local_640);
  uVar156 = auVar12._0_4_;
  local_260._4_4_ = uVar156;
  local_260._0_4_ = uVar156;
  local_260._8_4_ = uVar156;
  local_260._12_4_ = uVar156;
  local_260._16_4_ = uVar156;
  local_260._20_4_ = uVar156;
  local_260._24_4_ = uVar156;
  local_260._28_4_ = uVar156;
  local_680 = ZEXT1632(auVar12);
  local_6c0 = vpermps_avx2(auVar107,local_680);
  auVar224 = ZEXT3264(local_6c0);
  auVar88 = vpermps_avx512vl(auVar108,local_680);
  auVar89 = vpermps_avx512vl(auVar109,local_680);
  auVar85 = vbroadcastss_avx512vl(auVar74);
  local_660 = ZEXT1632(auVar74);
  auVar90 = vpermps_avx512vl(auVar107,local_660);
  auVar91 = vpermps_avx512vl(auVar108,local_660);
  auVar92 = vpermps_avx512vl(auVar109,local_660);
  auVar93 = vbroadcastss_avx512vl(auVar75);
  _local_6a0 = ZEXT1632(auVar75);
  auVar83 = vpermps_avx512vl(auVar107,_local_6a0);
  auVar94 = vpermps_avx512vl(auVar108,_local_6a0);
  auVar95 = vpermps_avx512vl(auVar109,_local_6a0);
  auVar73 = vmulss_avx512f(auVar78,auVar78);
  auVar81 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),local_540,local_540);
  local_240 = vfmadd231ps_avx512vl(auVar81,_local_520,_local_520);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar106);
  local_720 = ZEXT416((uint)fVar141);
  local_280 = fVar202 - fVar141;
  fStack_27c = local_280;
  fStack_278 = local_280;
  fStack_274 = local_280;
  fStack_270 = local_280;
  fStack_26c = local_280;
  fStack_268 = local_280;
  fStack_264 = local_280;
  local_460 = vpbroadcastd_avx512vl();
  local_ad8 = 1;
  uVar60 = 0;
  bVar63 = false;
  local_480 = vpbroadcastd_avx512vl();
  auVar73 = vsqrtss_avx(local_7c0,local_7c0);
  auVar12 = vsqrtss_avx(local_7c0,local_7c0);
  local_730 = ZEXT816(0x3f80000000000000);
  auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  do {
    auVar74 = vmovshdup_avx(local_730);
    auVar74 = vsubps_avx(auVar74,local_730);
    fVar155 = auVar74._0_4_;
    fVar172 = fVar155 * 0.04761905;
    auVar213._0_4_ = local_730._0_4_;
    auVar213._4_4_ = auVar213._0_4_;
    auVar213._8_4_ = auVar213._0_4_;
    auVar213._12_4_ = auVar213._0_4_;
    auVar213._16_4_ = auVar213._0_4_;
    auVar213._20_4_ = auVar213._0_4_;
    auVar213._24_4_ = auVar213._0_4_;
    auVar213._28_4_ = auVar213._0_4_;
    auVar240._4_4_ = fVar155;
    auVar240._0_4_ = fVar155;
    auVar240._8_4_ = fVar155;
    auVar240._12_4_ = fVar155;
    auVar240._16_4_ = fVar155;
    auVar240._20_4_ = fVar155;
    auVar240._24_4_ = fVar155;
    auVar240._28_4_ = fVar155;
    auVar74 = vfmadd231ps_fma(auVar213,auVar240,_DAT_01faff20);
    auVar230 = auVar233._0_32_;
    auVar81 = vsubps_avx(auVar230,ZEXT1632(auVar74));
    fVar155 = auVar74._0_4_;
    fVar168 = auVar74._4_4_;
    auVar51._4_4_ = local_260._4_4_ * fVar168;
    auVar51._0_4_ = local_260._0_4_ * fVar155;
    fVar169 = auVar74._8_4_;
    auVar51._8_4_ = local_260._8_4_ * fVar169;
    fVar170 = auVar74._12_4_;
    auVar51._12_4_ = local_260._12_4_ * fVar170;
    auVar51._16_4_ = local_260._16_4_ * 0.0;
    auVar51._20_4_ = local_260._20_4_ * 0.0;
    auVar51._24_4_ = local_260._24_4_ * 0.0;
    auVar51._28_4_ = DAT_01faff20._28_4_;
    auVar97 = ZEXT1632(auVar74);
    auVar115._4_4_ = auVar224._4_4_ * fVar168;
    auVar115._0_4_ = auVar224._0_4_ * fVar155;
    auVar115._8_4_ = auVar224._8_4_ * fVar169;
    auVar115._12_4_ = auVar224._12_4_ * fVar170;
    auVar115._16_4_ = auVar224._16_4_ * 0.0;
    auVar115._20_4_ = auVar224._20_4_ * 0.0;
    auVar115._24_4_ = auVar224._24_4_ * 0.0;
    auVar115._28_4_ = auVar213._0_4_;
    auVar82 = vmulps_avx512vl(auVar88,auVar97);
    auVar96 = vmulps_avx512vl(auVar89,auVar97);
    auVar75 = vfmadd231ps_fma(auVar51,auVar81,auVar244);
    auVar71 = vfmadd231ps_fma(auVar115,auVar81,auVar86);
    auVar76 = vfmadd231ps_fma(auVar82,auVar81,auVar84);
    auVar82 = vfmadd231ps_avx512vl(auVar96,auVar81,auVar87);
    auVar96 = vmulps_avx512vl(auVar85,auVar97);
    auVar102 = ZEXT1632(auVar74);
    auVar97 = vmulps_avx512vl(auVar90,auVar102);
    auVar98 = vmulps_avx512vl(auVar91,auVar102);
    auVar99 = vmulps_avx512vl(auVar92,auVar102);
    auVar77 = vfmadd231ps_fma(auVar96,auVar81,local_260);
    auVar72 = vfmadd231ps_fma(auVar97,auVar81,auVar224._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar98,auVar81,auVar88);
    auVar97 = vfmadd231ps_avx512vl(auVar99,auVar81,auVar89);
    auVar98 = vmulps_avx512vl(auVar93,auVar102);
    auVar99 = vmulps_avx512vl(auVar83,auVar102);
    auVar100 = vmulps_avx512vl(auVar94,auVar102);
    auVar101 = vmulps_avx512vl(auVar95,auVar102);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar81,auVar85);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar81,auVar90);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar81,auVar91);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar81,auVar92);
    auVar116._28_4_ = auVar224._28_4_;
    auVar116._0_28_ =
         ZEXT1628(CONCAT412(fVar170 * auVar77._12_4_,
                            CONCAT48(fVar169 * auVar77._8_4_,
                                     CONCAT44(fVar168 * auVar77._4_4_,fVar155 * auVar77._0_4_))));
    auVar102 = vmulps_avx512vl(auVar102,ZEXT1632(auVar72));
    auVar103 = vmulps_avx512vl(ZEXT1632(auVar74),auVar96);
    auVar104 = vmulps_avx512vl(ZEXT1632(auVar74),auVar97);
    auVar74 = vfmadd231ps_fma(auVar116,auVar81,ZEXT1632(auVar75));
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar81,ZEXT1632(auVar71));
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar81,ZEXT1632(auVar76));
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar81,auVar82);
    auVar117._4_4_ = auVar98._4_4_ * fVar168;
    auVar117._0_4_ = auVar98._0_4_ * fVar155;
    auVar117._8_4_ = auVar98._8_4_ * fVar169;
    auVar117._12_4_ = auVar98._12_4_ * fVar170;
    auVar117._16_4_ = auVar98._16_4_ * 0.0;
    auVar117._20_4_ = auVar98._20_4_ * 0.0;
    auVar117._24_4_ = auVar98._24_4_ * 0.0;
    auVar117._28_4_ = auVar82._28_4_;
    auVar220._4_4_ = auVar99._4_4_ * fVar168;
    auVar220._0_4_ = auVar99._0_4_ * fVar155;
    auVar220._8_4_ = auVar99._8_4_ * fVar169;
    auVar220._12_4_ = auVar99._12_4_ * fVar170;
    auVar220._16_4_ = auVar99._16_4_ * 0.0;
    auVar220._20_4_ = auVar99._20_4_ * 0.0;
    auVar220._24_4_ = auVar99._24_4_ * 0.0;
    auVar220._28_4_ = auVar98._28_4_;
    auVar118._4_4_ = auVar100._4_4_ * fVar168;
    auVar118._0_4_ = auVar100._0_4_ * fVar155;
    auVar118._8_4_ = auVar100._8_4_ * fVar169;
    auVar118._12_4_ = auVar100._12_4_ * fVar170;
    auVar118._16_4_ = auVar100._16_4_ * 0.0;
    auVar118._20_4_ = auVar100._20_4_ * 0.0;
    auVar118._24_4_ = auVar100._24_4_ * 0.0;
    auVar118._28_4_ = auVar99._28_4_;
    auVar119._4_4_ = auVar101._4_4_ * fVar168;
    auVar119._0_4_ = auVar101._0_4_ * fVar155;
    auVar119._8_4_ = auVar101._8_4_ * fVar169;
    auVar119._12_4_ = auVar101._12_4_ * fVar170;
    auVar119._16_4_ = auVar101._16_4_ * 0.0;
    auVar119._20_4_ = auVar101._20_4_ * 0.0;
    auVar119._24_4_ = auVar101._24_4_ * 0.0;
    auVar119._28_4_ = auVar100._28_4_;
    auVar75 = vfmadd231ps_fma(auVar117,auVar81,ZEXT1632(auVar77));
    auVar71 = vfmadd231ps_fma(auVar220,auVar81,ZEXT1632(auVar72));
    auVar76 = vfmadd231ps_fma(auVar118,auVar81,auVar96);
    auVar77 = vfmadd231ps_fma(auVar119,auVar81,auVar97);
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar170 * auVar75._12_4_,
                                                 CONCAT48(fVar169 * auVar75._8_4_,
                                                          CONCAT44(fVar168 * auVar75._4_4_,
                                                                   fVar155 * auVar75._0_4_)))),
                              auVar81,ZEXT1632(auVar74));
    auVar99 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar71._12_4_ * fVar170,
                                            CONCAT48(auVar71._8_4_ * fVar169,
                                                     CONCAT44(auVar71._4_4_ * fVar168,
                                                              auVar71._0_4_ * fVar155)))),auVar81,
                         auVar102);
    auVar100 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar76._12_4_ * fVar170,
                                             CONCAT48(auVar76._8_4_ * fVar169,
                                                      CONCAT44(auVar76._4_4_ * fVar168,
                                                               auVar76._0_4_ * fVar155)))),auVar81,
                          auVar103);
    auVar82 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar77._12_4_ * fVar170,
                                            CONCAT48(auVar77._8_4_ * fVar169,
                                                     CONCAT44(auVar77._4_4_ * fVar168,
                                                              auVar77._0_4_ * fVar155)))),auVar104,
                         auVar81);
    auVar81 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar74));
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar71),auVar102);
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar76),auVar103);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar77),auVar104);
    auVar246._0_4_ = fVar172 * auVar81._0_4_ * 3.0;
    auVar246._4_4_ = fVar172 * auVar81._4_4_ * 3.0;
    auVar246._8_4_ = fVar172 * auVar81._8_4_ * 3.0;
    auVar246._12_4_ = fVar172 * auVar81._12_4_ * 3.0;
    auVar246._16_4_ = fVar172 * auVar81._16_4_ * 3.0;
    auVar246._20_4_ = fVar172 * auVar81._20_4_ * 3.0;
    auVar246._24_4_ = fVar172 * auVar81._24_4_ * 3.0;
    auVar246._28_4_ = 0;
    auVar247._0_4_ = fVar172 * auVar96._0_4_ * 3.0;
    auVar247._4_4_ = fVar172 * auVar96._4_4_ * 3.0;
    auVar247._8_4_ = fVar172 * auVar96._8_4_ * 3.0;
    auVar247._12_4_ = fVar172 * auVar96._12_4_ * 3.0;
    auVar247._16_4_ = fVar172 * auVar96._16_4_ * 3.0;
    auVar247._20_4_ = fVar172 * auVar96._20_4_ * 3.0;
    auVar247._24_4_ = fVar172 * auVar96._24_4_ * 3.0;
    auVar247._28_4_ = 0;
    auVar122._4_4_ = fVar172 * auVar97._4_4_ * 3.0;
    auVar122._0_4_ = fVar172 * auVar97._0_4_ * 3.0;
    auVar122._8_4_ = fVar172 * auVar97._8_4_ * 3.0;
    auVar122._12_4_ = fVar172 * auVar97._12_4_ * 3.0;
    auVar122._16_4_ = fVar172 * auVar97._16_4_ * 3.0;
    auVar122._20_4_ = fVar172 * auVar97._20_4_ * 3.0;
    auVar122._24_4_ = fVar172 * auVar97._24_4_ * 3.0;
    auVar122._28_4_ = auVar101._28_4_;
    fVar155 = auVar98._0_4_ * 3.0 * fVar172;
    fVar168 = auVar98._4_4_ * 3.0 * fVar172;
    auVar123._4_4_ = fVar168;
    auVar123._0_4_ = fVar155;
    fVar169 = auVar98._8_4_ * 3.0 * fVar172;
    auVar123._8_4_ = fVar169;
    fVar170 = auVar98._12_4_ * 3.0 * fVar172;
    auVar123._12_4_ = fVar170;
    fVar171 = auVar98._16_4_ * 3.0 * fVar172;
    auVar123._16_4_ = fVar171;
    fVar201 = auVar98._20_4_ * 3.0 * fVar172;
    auVar123._20_4_ = fVar201;
    fVar173 = auVar98._24_4_ * 3.0 * fVar172;
    auVar123._24_4_ = fVar173;
    auVar123._28_4_ = fVar172;
    auVar74 = vxorps_avx512vl(auVar87._0_16_,auVar87._0_16_);
    auVar101 = vpermt2ps_avx512vl(ZEXT1632(auVar72),_DAT_01feed00,ZEXT1632(auVar74));
    auVar102 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,ZEXT1632(auVar74));
    auVar96 = ZEXT1632(auVar74);
    auVar103 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,auVar96);
    auVar231._0_4_ = auVar82._0_4_ + fVar155;
    auVar231._4_4_ = auVar82._4_4_ + fVar168;
    auVar231._8_4_ = auVar82._8_4_ + fVar169;
    auVar231._12_4_ = auVar82._12_4_ + fVar170;
    auVar231._16_4_ = auVar82._16_4_ + fVar171;
    auVar231._20_4_ = auVar82._20_4_ + fVar201;
    auVar231._24_4_ = auVar82._24_4_ + fVar173;
    auVar231._28_4_ = auVar82._28_4_ + fVar172;
    auVar81 = vmaxps_avx(auVar82,auVar231);
    auVar104 = vminps_avx512vl(auVar82,auVar231);
    auVar105 = vpermt2ps_avx512vl(auVar82,_DAT_01feed00,auVar96);
    auVar106 = vpermt2ps_avx512vl(auVar246,_DAT_01feed00,auVar96);
    auVar107 = vpermt2ps_avx512vl(auVar247,_DAT_01feed00,auVar96);
    auVar118 = ZEXT1632(auVar74);
    auVar108 = vpermt2ps_avx512vl(auVar122,_DAT_01feed00,auVar118);
    auVar82 = vpermt2ps_avx512vl(auVar123,_DAT_01feed00,auVar118);
    auVar82 = vsubps_avx(auVar105,auVar82);
    auVar96 = vsubps_avx(auVar101,ZEXT1632(auVar72));
    auVar97 = vsubps_avx(auVar102,auVar99);
    auVar98 = vsubps_avx(auVar103,auVar100);
    auVar109 = vmulps_avx512vl(auVar97,auVar122);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar247,auVar98);
    auVar110 = vmulps_avx512vl(auVar98,auVar246);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar122,auVar96);
    auVar111 = vmulps_avx512vl(auVar96,auVar247);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar246,auVar97);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar110 = vmulps_avx512vl(auVar98,auVar98);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar97,auVar97);
    auVar112 = vfmadd231ps_avx512vl(auVar110,auVar96,auVar96);
    auVar110 = vrcp14ps_avx512vl(auVar112);
    auVar111 = vfnmadd213ps_avx512vl(auVar110,auVar112,auVar230);
    auVar110 = vfmadd132ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vmulps_avx512vl(auVar109,auVar110);
    auVar111 = vmulps_avx512vl(auVar97,auVar108);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar107,auVar98);
    auVar113 = vmulps_avx512vl(auVar98,auVar106);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar108,auVar96);
    auVar114 = vmulps_avx512vl(auVar96,auVar107);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar106,auVar97);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar111 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar111);
    auVar110 = vmulps_avx512vl(auVar111,auVar110);
    auVar109 = vmaxps_avx512vl(auVar109,auVar110);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar110 = vmaxps_avx512vl(auVar82,auVar105);
    auVar81 = vmaxps_avx512vl(auVar81,auVar110);
    auVar114 = vaddps_avx512vl(auVar109,auVar81);
    auVar81 = vminps_avx(auVar82,auVar105);
    auVar81 = vminps_avx512vl(auVar104,auVar81);
    auVar81 = vsubps_avx512vl(auVar81,auVar109);
    auVar110._8_4_ = 0x3f800002;
    auVar110._0_8_ = 0x3f8000023f800002;
    auVar110._12_4_ = 0x3f800002;
    auVar110._16_4_ = 0x3f800002;
    auVar110._20_4_ = 0x3f800002;
    auVar110._24_4_ = 0x3f800002;
    auVar110._28_4_ = 0x3f800002;
    auVar82 = vmulps_avx512vl(auVar114,auVar110);
    auVar111._8_4_ = 0x3f7ffffc;
    auVar111._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar111._12_4_ = 0x3f7ffffc;
    auVar111._16_4_ = 0x3f7ffffc;
    auVar111._20_4_ = 0x3f7ffffc;
    auVar111._24_4_ = 0x3f7ffffc;
    auVar111._28_4_ = 0x3f7ffffc;
    auVar81 = vmulps_avx512vl(auVar81,auVar111);
    auVar82 = vmulps_avx512vl(auVar82,auVar82);
    auVar104 = vrsqrt14ps_avx512vl(auVar112);
    auVar113._8_4_ = 0xbf000000;
    auVar113._0_8_ = 0xbf000000bf000000;
    auVar113._12_4_ = 0xbf000000;
    auVar113._16_4_ = 0xbf000000;
    auVar113._20_4_ = 0xbf000000;
    auVar113._24_4_ = 0xbf000000;
    auVar113._28_4_ = 0xbf000000;
    auVar105 = vmulps_avx512vl(auVar112,auVar113);
    fVar155 = auVar104._0_4_;
    fVar168 = auVar104._4_4_;
    fVar169 = auVar104._8_4_;
    fVar170 = auVar104._12_4_;
    fVar172 = auVar104._16_4_;
    fVar171 = auVar104._20_4_;
    fVar201 = auVar104._24_4_;
    auVar34._4_4_ = fVar168 * fVar168 * fVar168 * auVar105._4_4_;
    auVar34._0_4_ = fVar155 * fVar155 * fVar155 * auVar105._0_4_;
    auVar34._8_4_ = fVar169 * fVar169 * fVar169 * auVar105._8_4_;
    auVar34._12_4_ = fVar170 * fVar170 * fVar170 * auVar105._12_4_;
    auVar34._16_4_ = fVar172 * fVar172 * fVar172 * auVar105._16_4_;
    auVar34._20_4_ = fVar171 * fVar171 * fVar171 * auVar105._20_4_;
    auVar34._24_4_ = fVar201 * fVar201 * fVar201 * auVar105._24_4_;
    auVar34._28_4_ = auVar114._28_4_;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar104 = vfmadd231ps_avx512vl(auVar34,auVar104,auVar112);
    auVar105 = vmulps_avx512vl(auVar96,auVar104);
    auVar109 = vmulps_avx512vl(auVar97,auVar104);
    auVar110 = vmulps_avx512vl(auVar98,auVar104);
    auVar220 = ZEXT1632(auVar72);
    auVar111 = vsubps_avx512vl(auVar118,auVar220);
    auVar113 = vsubps_avx512vl(auVar118,auVar99);
    auVar112 = vsubps_avx512vl(auVar118,auVar100);
    auVar114 = vmulps_avx512vl(local_620,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_540,auVar113);
    auVar114 = vfmadd231ps_avx512vl(auVar114,_local_520,auVar111);
    auVar115 = vmulps_avx512vl(auVar112,auVar112);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar113,auVar113);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar111);
    auVar116 = vmulps_avx512vl(local_620,auVar110);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar109,local_540);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar105,_local_520);
    auVar110 = vmulps_avx512vl(auVar112,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar113,auVar109);
    auVar105 = vfmadd231ps_avx512vl(auVar109,auVar111,auVar105);
    auVar109 = vmulps_avx512vl(auVar116,auVar116);
    auVar110 = vsubps_avx512vl(local_220,auVar109);
    auVar117 = vmulps_avx512vl(auVar116,auVar105);
    auVar114 = vsubps_avx512vl(auVar114,auVar117);
    auVar117 = vaddps_avx512vl(auVar114,auVar114);
    auVar114 = vmulps_avx512vl(auVar105,auVar105);
    local_780 = vsubps_avx512vl(auVar115,auVar114);
    auVar82 = vsubps_avx512vl(local_780,auVar82);
    local_560 = vmulps_avx512vl(auVar117,auVar117);
    auVar114._8_4_ = 0x40800000;
    auVar114._0_8_ = 0x4080000040800000;
    auVar114._12_4_ = 0x40800000;
    auVar114._16_4_ = 0x40800000;
    auVar114._20_4_ = 0x40800000;
    auVar114._24_4_ = 0x40800000;
    auVar114._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar110,auVar114);
    auVar114 = vmulps_avx512vl(_local_580,auVar82);
    auVar114 = vsubps_avx512vl(local_560,auVar114);
    uVar69 = vcmpps_avx512vl(auVar114,auVar118,5);
    bVar52 = (byte)uVar69;
    if (bVar52 == 0) {
      auVar233 = ZEXT3264(auVar230);
LAB_01d4e526:
      auVar224 = ZEXT3264(local_6c0);
    }
    else {
      auVar114 = vsqrtps_avx512vl(auVar114);
      auVar115 = vaddps_avx512vl(auVar110,auVar110);
      local_600 = vrcp14ps_avx512vl(auVar115);
      auVar118 = vfnmadd213ps_avx512vl(local_600,auVar115,auVar230);
      auVar118 = vfmadd132ps_avx512vl(auVar118,local_600,local_600);
      auVar230._8_4_ = 0x80000000;
      auVar230._0_8_ = 0x8000000080000000;
      auVar230._12_4_ = 0x80000000;
      auVar230._16_4_ = 0x80000000;
      auVar230._20_4_ = 0x80000000;
      auVar230._24_4_ = 0x80000000;
      auVar230._28_4_ = 0x80000000;
      local_5a0 = vxorps_avx512vl(auVar117,auVar230);
      auVar119 = vsubps_avx512vl(local_5a0,auVar114);
      local_7a0 = vmulps_avx512vl(auVar119,auVar118);
      auVar114 = vsubps_avx512vl(auVar114,auVar117);
      local_7e0 = vmulps_avx512vl(auVar114,auVar118);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar118 = vblendmps_avx512vl(auVar114,local_7a0);
      auVar120._0_4_ =
           (uint)(bVar52 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar114._0_4_;
      bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar67 * auVar118._4_4_ | (uint)!bVar67 * auVar114._4_4_;
      bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar67 * auVar118._8_4_ | (uint)!bVar67 * auVar114._8_4_;
      bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar67 * auVar118._12_4_ | (uint)!bVar67 * auVar114._12_4_;
      bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar67 * auVar118._16_4_ | (uint)!bVar67 * auVar114._16_4_;
      bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar67 * auVar118._20_4_ | (uint)!bVar67 * auVar114._20_4_;
      bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar67 * auVar118._24_4_ | (uint)!bVar67 * auVar114._24_4_;
      bVar67 = SUB81(uVar69 >> 7,0);
      auVar120._28_4_ = (uint)bVar67 * auVar118._28_4_ | (uint)!bVar67 * auVar114._28_4_;
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar118 = vblendmps_avx512vl(auVar114,local_7e0);
      auVar121._0_4_ =
           (uint)(bVar52 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar114._0_4_;
      bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar67 * auVar118._4_4_ | (uint)!bVar67 * auVar114._4_4_;
      bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar67 * auVar118._8_4_ | (uint)!bVar67 * auVar114._8_4_;
      bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar67 * auVar118._12_4_ | (uint)!bVar67 * auVar114._12_4_;
      bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar67 * auVar118._16_4_ | (uint)!bVar67 * auVar114._16_4_;
      bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar67 * auVar118._20_4_ | (uint)!bVar67 * auVar114._20_4_;
      bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar67 * auVar118._24_4_ | (uint)!bVar67 * auVar114._24_4_;
      bVar67 = SUB81(uVar69 >> 7,0);
      auVar121._28_4_ = (uint)bVar67 * auVar118._28_4_ | (uint)!bVar67 * auVar114._28_4_;
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar109,auVar114);
      local_5c0 = vmaxps_avx512vl(local_240,auVar114);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      local_5e0 = vmulps_avx512vl(local_5c0,auVar28);
      vandps_avx512vl(auVar110,auVar114);
      uVar62 = vcmpps_avx512vl(local_5e0,local_5e0,1);
      uVar69 = uVar69 & uVar62;
      bVar54 = (byte)uVar69;
      if (bVar54 != 0) {
        uVar62 = vcmpps_avx512vl(auVar82,_DAT_01faff00,2);
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar110 = vblendmps_avx512vl(auVar82,auVar109);
        bVar57 = (byte)uVar62;
        uVar70 = (uint)(bVar57 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar57 & 1) * local_5e0._0_4_;
        bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
        uVar61 = (uint)bVar67 * auVar110._4_4_ | (uint)!bVar67 * local_5e0._4_4_;
        bVar67 = (bool)((byte)(uVar62 >> 2) & 1);
        uVar56 = (uint)bVar67 * auVar110._8_4_ | (uint)!bVar67 * local_5e0._8_4_;
        bVar67 = (bool)((byte)(uVar62 >> 3) & 1);
        uVar135 = (uint)bVar67 * auVar110._12_4_ | (uint)!bVar67 * local_5e0._12_4_;
        bVar67 = (bool)((byte)(uVar62 >> 4) & 1);
        uVar136 = (uint)bVar67 * auVar110._16_4_ | (uint)!bVar67 * local_5e0._16_4_;
        bVar67 = (bool)((byte)(uVar62 >> 5) & 1);
        uVar137 = (uint)bVar67 * auVar110._20_4_ | (uint)!bVar67 * local_5e0._20_4_;
        bVar67 = (bool)((byte)(uVar62 >> 6) & 1);
        uVar138 = (uint)bVar67 * auVar110._24_4_ | (uint)!bVar67 * local_5e0._24_4_;
        bVar67 = SUB81(uVar62 >> 7,0);
        uVar139 = (uint)bVar67 * auVar110._28_4_ | (uint)!bVar67 * local_5e0._28_4_;
        auVar120._0_4_ = (bVar54 & 1) * uVar70 | !(bool)(bVar54 & 1) * auVar120._0_4_;
        bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar120._4_4_ = bVar67 * uVar61 | !bVar67 * auVar120._4_4_;
        bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar120._8_4_ = bVar67 * uVar56 | !bVar67 * auVar120._8_4_;
        bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar120._12_4_ = bVar67 * uVar135 | !bVar67 * auVar120._12_4_;
        bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar120._16_4_ = bVar67 * uVar136 | !bVar67 * auVar120._16_4_;
        bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar120._20_4_ = bVar67 * uVar137 | !bVar67 * auVar120._20_4_;
        bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar120._24_4_ = bVar67 * uVar138 | !bVar67 * auVar120._24_4_;
        bVar67 = SUB81(uVar69 >> 7,0);
        auVar120._28_4_ = bVar67 * uVar139 | !bVar67 * auVar120._28_4_;
        auVar82 = vblendmps_avx512vl(auVar109,auVar82);
        bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar10 = SUB81(uVar62 >> 7,0);
        auVar121._0_4_ =
             (uint)(bVar54 & 1) *
             ((uint)(bVar57 & 1) * auVar82._0_4_ | !(bool)(bVar57 & 1) * uVar70) |
             !(bool)(bVar54 & 1) * auVar121._0_4_;
        bVar4 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar121._4_4_ =
             (uint)bVar4 * ((uint)bVar67 * auVar82._4_4_ | !bVar67 * uVar61) |
             !bVar4 * auVar121._4_4_;
        bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar121._8_4_ =
             (uint)bVar67 * ((uint)bVar5 * auVar82._8_4_ | !bVar5 * uVar56) |
             !bVar67 * auVar121._8_4_;
        bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar121._12_4_ =
             (uint)bVar67 * ((uint)bVar6 * auVar82._12_4_ | !bVar6 * uVar135) |
             !bVar67 * auVar121._12_4_;
        bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar121._16_4_ =
             (uint)bVar67 * ((uint)bVar7 * auVar82._16_4_ | !bVar7 * uVar136) |
             !bVar67 * auVar121._16_4_;
        bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar121._20_4_ =
             (uint)bVar67 * ((uint)bVar8 * auVar82._20_4_ | !bVar8 * uVar137) |
             !bVar67 * auVar121._20_4_;
        bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar121._24_4_ =
             (uint)bVar67 * ((uint)bVar9 * auVar82._24_4_ | !bVar9 * uVar138) |
             !bVar67 * auVar121._24_4_;
        bVar67 = SUB81(uVar69 >> 7,0);
        auVar121._28_4_ =
             (uint)bVar67 * ((uint)bVar10 * auVar82._28_4_ | !bVar10 * uVar139) |
             !bVar67 * auVar121._28_4_;
        bVar52 = (~bVar54 | bVar57) & bVar52;
      }
      if ((bVar52 & 0x7f) == 0) {
        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        goto LAB_01d4e526;
      }
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar108 = vxorps_avx512vl(auVar108,auVar109);
      auVar106 = vxorps_avx512vl(auVar106,auVar109);
      uVar70 = *(uint *)(ray + k * 4 + 0x100);
      auVar107 = vxorps_avx512vl(auVar107,auVar109);
      auVar74 = vsubss_avx512f(ZEXT416(uVar70),ZEXT416((uint)local_720._0_4_));
      auVar82 = vbroadcastss_avx512vl(auVar74);
      auVar110 = vminps_avx512vl(auVar82,auVar121);
      auVar50._4_4_ = fStack_27c;
      auVar50._0_4_ = local_280;
      auVar50._8_4_ = fStack_278;
      auVar50._12_4_ = fStack_274;
      auVar50._16_4_ = fStack_270;
      auVar50._20_4_ = fStack_26c;
      auVar50._24_4_ = fStack_268;
      auVar50._28_4_ = fStack_264;
      auVar82 = vmaxps_avx512vl(auVar50,auVar120);
      auVar112 = vmulps_avx512vl(auVar112,auVar122);
      auVar113 = vfmadd213ps_avx512vl(auVar113,auVar247,auVar112);
      auVar74 = vfmadd213ps_fma(auVar111,auVar246,auVar113);
      auVar111 = vmulps_avx512vl(local_620,auVar122);
      auVar111 = vfmadd231ps_avx512vl(auVar111,local_540,auVar247);
      auVar111 = vfmadd231ps_avx512vl(auVar111,_local_520,auVar246);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar111,auVar113);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar113,auVar112,1);
      auVar114 = vxorps_avx512vl(ZEXT1632(auVar74),auVar109);
      auVar118 = vrcp14ps_avx512vl(auVar111);
      auVar119 = vxorps_avx512vl(auVar111,auVar109);
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar123 = vfnmadd213ps_avx512vl(auVar118,auVar111,auVar122);
      auVar74 = vfmadd132ps_fma(auVar123,auVar118,auVar118);
      fVar155 = auVar74._0_4_ * auVar114._0_4_;
      fVar168 = auVar74._4_4_ * auVar114._4_4_;
      auVar35._4_4_ = fVar168;
      auVar35._0_4_ = fVar155;
      fVar169 = auVar74._8_4_ * auVar114._8_4_;
      auVar35._8_4_ = fVar169;
      fVar170 = auVar74._12_4_ * auVar114._12_4_;
      auVar35._12_4_ = fVar170;
      fVar172 = auVar114._16_4_ * 0.0;
      auVar35._16_4_ = fVar172;
      fVar171 = auVar114._20_4_ * 0.0;
      auVar35._20_4_ = fVar171;
      fVar201 = auVar114._24_4_ * 0.0;
      auVar35._24_4_ = fVar201;
      auVar35._28_4_ = auVar114._28_4_;
      uVar15 = vcmpps_avx512vl(auVar111,auVar119,1);
      bVar54 = (byte)uVar14 | (byte)uVar15;
      auVar242._8_4_ = 0xff800000;
      auVar242._0_8_ = 0xff800000ff800000;
      auVar242._12_4_ = 0xff800000;
      auVar242._16_4_ = 0xff800000;
      auVar242._20_4_ = 0xff800000;
      auVar242._24_4_ = 0xff800000;
      auVar242._28_4_ = 0xff800000;
      auVar123 = vblendmps_avx512vl(auVar35,auVar242);
      auVar124._0_4_ =
           (uint)(bVar54 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar118._0_4_;
      bVar67 = (bool)(bVar54 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar67 * auVar123._4_4_ | (uint)!bVar67 * auVar118._4_4_;
      bVar67 = (bool)(bVar54 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar67 * auVar123._8_4_ | (uint)!bVar67 * auVar118._8_4_;
      bVar67 = (bool)(bVar54 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar67 * auVar123._12_4_ | (uint)!bVar67 * auVar118._12_4_;
      bVar67 = (bool)(bVar54 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar67 * auVar123._16_4_ | (uint)!bVar67 * auVar118._16_4_;
      bVar67 = (bool)(bVar54 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar67 * auVar123._20_4_ | (uint)!bVar67 * auVar118._20_4_;
      bVar67 = (bool)(bVar54 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar67 * auVar123._24_4_ | (uint)!bVar67 * auVar118._24_4_;
      auVar124._28_4_ =
           (uint)(bVar54 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar54 >> 7) * auVar118._28_4_;
      auVar118 = vmaxps_avx512vl(auVar82,auVar124);
      uVar15 = vcmpps_avx512vl(auVar111,auVar119,6);
      bVar54 = (byte)uVar14 | (byte)uVar15;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar125._0_4_ =
           (uint)(bVar54 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar54 & 1) * (int)fVar155;
      bVar67 = (bool)(bVar54 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar67 * auVar111._4_4_ | (uint)!bVar67 * (int)fVar168;
      bVar67 = (bool)(bVar54 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar67 * auVar111._8_4_ | (uint)!bVar67 * (int)fVar169;
      bVar67 = (bool)(bVar54 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar67 * auVar111._12_4_ | (uint)!bVar67 * (int)fVar170;
      bVar67 = (bool)(bVar54 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar67 * auVar111._16_4_ | (uint)!bVar67 * (int)fVar172;
      bVar67 = (bool)(bVar54 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar67 * auVar111._20_4_ | (uint)!bVar67 * (int)fVar171;
      bVar67 = (bool)(bVar54 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar67 * auVar111._24_4_ | (uint)!bVar67 * (int)fVar201;
      auVar125._28_4_ =
           (uint)(bVar54 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar54 >> 7) * auVar114._28_4_;
      auVar114 = vminps_avx512vl(auVar110,auVar125);
      auVar82 = vsubps_avx(ZEXT832(0) << 0x20,auVar101);
      auVar101 = vsubps_avx(ZEXT832(0) << 0x20,auVar102);
      auVar119 = ZEXT832(0) << 0x20;
      auVar102 = vsubps_avx(auVar119,auVar103);
      auVar102 = vmulps_avx512vl(auVar102,auVar108);
      auVar101 = vfmadd231ps_avx512vl(auVar102,auVar107,auVar101);
      auVar82 = vfmadd231ps_avx512vl(auVar101,auVar106,auVar82);
      auVar101 = vmulps_avx512vl(local_620,auVar108);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_540,auVar107);
      auVar101 = vfmadd231ps_avx512vl(auVar101,_local_520,auVar106);
      vandps_avx512vl(auVar101,auVar113);
      uVar14 = vcmpps_avx512vl(auVar101,auVar112,1);
      auVar102 = vxorps_avx512vl(auVar82,auVar109);
      auVar82 = vrcp14ps_avx512vl(auVar101);
      auVar103 = vxorps_avx512vl(auVar101,auVar109);
      auVar106 = vfnmadd213ps_avx512vl(auVar82,auVar101,auVar122);
      auVar74 = vfmadd132ps_fma(auVar106,auVar82,auVar82);
      fVar155 = auVar74._0_4_ * auVar102._0_4_;
      fVar168 = auVar74._4_4_ * auVar102._4_4_;
      auVar36._4_4_ = fVar168;
      auVar36._0_4_ = fVar155;
      fVar169 = auVar74._8_4_ * auVar102._8_4_;
      auVar36._8_4_ = fVar169;
      fVar170 = auVar74._12_4_ * auVar102._12_4_;
      auVar36._12_4_ = fVar170;
      fVar172 = auVar102._16_4_ * 0.0;
      auVar36._16_4_ = fVar172;
      fVar171 = auVar102._20_4_ * 0.0;
      auVar36._20_4_ = fVar171;
      fVar201 = auVar102._24_4_ * 0.0;
      auVar36._24_4_ = fVar201;
      auVar36._28_4_ = auVar102._28_4_;
      uVar15 = vcmpps_avx512vl(auVar101,auVar103,1);
      bVar54 = (byte)uVar14 | (byte)uVar15;
      auVar106 = vblendmps_avx512vl(auVar36,auVar242);
      auVar126._0_4_ =
           (uint)(bVar54 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar82._0_4_;
      bVar67 = (bool)(bVar54 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar67 * auVar106._4_4_ | (uint)!bVar67 * auVar82._4_4_;
      bVar67 = (bool)(bVar54 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar67 * auVar106._8_4_ | (uint)!bVar67 * auVar82._8_4_;
      bVar67 = (bool)(bVar54 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar67 * auVar106._12_4_ | (uint)!bVar67 * auVar82._12_4_;
      bVar67 = (bool)(bVar54 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar67 * auVar106._16_4_ | (uint)!bVar67 * auVar82._16_4_;
      bVar67 = (bool)(bVar54 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar67 * auVar106._20_4_ | (uint)!bVar67 * auVar82._20_4_;
      bVar67 = (bool)(bVar54 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar67 * auVar106._24_4_ | (uint)!bVar67 * auVar82._24_4_;
      auVar126._28_4_ =
           (uint)(bVar54 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar54 >> 7) * auVar82._28_4_;
      auVar82 = vmaxps_avx(auVar118,auVar126);
      uVar15 = vcmpps_avx512vl(auVar101,auVar103,6);
      bVar54 = (byte)uVar14 | (byte)uVar15;
      auVar127._0_4_ =
           (uint)(bVar54 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar54 & 1) * (int)fVar155;
      bVar67 = (bool)(bVar54 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar67 * auVar111._4_4_ | (uint)!bVar67 * (int)fVar168;
      bVar67 = (bool)(bVar54 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar67 * auVar111._8_4_ | (uint)!bVar67 * (int)fVar169;
      bVar67 = (bool)(bVar54 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar67 * auVar111._12_4_ | (uint)!bVar67 * (int)fVar170;
      bVar67 = (bool)(bVar54 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar67 * auVar111._16_4_ | (uint)!bVar67 * (int)fVar172;
      bVar67 = (bool)(bVar54 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar67 * auVar111._20_4_ | (uint)!bVar67 * (int)fVar171;
      bVar67 = (bool)(bVar54 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar67 * auVar111._24_4_ | (uint)!bVar67 * (int)fVar201;
      auVar127._28_4_ =
           (uint)(bVar54 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar54 >> 7) * auVar102._28_4_;
      local_300 = vminps_avx(auVar114,auVar127);
      uVar14 = vcmpps_avx512vl(auVar82,local_300,2);
      bVar52 = bVar52 & 0x7f & (byte)uVar14;
      if (bVar52 == 0) {
        auVar233 = ZEXT3264(auVar122);
        goto LAB_01d4e526;
      }
      auVar81 = vmaxps_avx(auVar119,auVar81);
      auVar101 = vfmadd213ps_avx512vl(local_7a0,auVar116,auVar105);
      fVar155 = auVar104._0_4_;
      fVar168 = auVar104._4_4_;
      auVar37._4_4_ = fVar168 * auVar101._4_4_;
      auVar37._0_4_ = fVar155 * auVar101._0_4_;
      fVar169 = auVar104._8_4_;
      auVar37._8_4_ = fVar169 * auVar101._8_4_;
      fVar170 = auVar104._12_4_;
      auVar37._12_4_ = fVar170 * auVar101._12_4_;
      fVar172 = auVar104._16_4_;
      auVar37._16_4_ = fVar172 * auVar101._16_4_;
      fVar171 = auVar104._20_4_;
      auVar37._20_4_ = fVar171 * auVar101._20_4_;
      fVar201 = auVar104._24_4_;
      auVar37._24_4_ = fVar201 * auVar101._24_4_;
      auVar37._28_4_ = auVar101._28_4_;
      auVar101 = vfmadd213ps_avx512vl(local_7e0,auVar116,auVar105);
      auVar38._4_4_ = fVar168 * auVar101._4_4_;
      auVar38._0_4_ = fVar155 * auVar101._0_4_;
      auVar38._8_4_ = fVar169 * auVar101._8_4_;
      auVar38._12_4_ = fVar170 * auVar101._12_4_;
      auVar38._16_4_ = fVar172 * auVar101._16_4_;
      auVar38._20_4_ = fVar171 * auVar101._20_4_;
      auVar38._24_4_ = fVar201 * auVar101._24_4_;
      auVar38._28_4_ = auVar126._28_4_;
      auVar101 = vminps_avx512vl(auVar37,auVar122);
      auVar47 = ZEXT812(0);
      auVar102 = ZEXT1232(auVar47) << 0x20;
      auVar101 = vmaxps_avx(auVar101,ZEXT1232(auVar47) << 0x20);
      auVar103 = vminps_avx512vl(auVar38,auVar122);
      auVar39._4_4_ = (auVar101._4_4_ + 1.0) * 0.125;
      auVar39._0_4_ = (auVar101._0_4_ + 0.0) * 0.125;
      auVar39._8_4_ = (auVar101._8_4_ + 2.0) * 0.125;
      auVar39._12_4_ = (auVar101._12_4_ + 3.0) * 0.125;
      auVar39._16_4_ = (auVar101._16_4_ + 4.0) * 0.125;
      auVar39._20_4_ = (auVar101._20_4_ + 5.0) * 0.125;
      auVar39._24_4_ = (auVar101._24_4_ + 6.0) * 0.125;
      auVar39._28_4_ = auVar101._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar39,auVar240,auVar213);
      auVar101 = vmaxps_avx(auVar103,ZEXT1232(auVar47) << 0x20);
      auVar40._4_4_ = (auVar101._4_4_ + 1.0) * 0.125;
      auVar40._0_4_ = (auVar101._0_4_ + 0.0) * 0.125;
      auVar40._8_4_ = (auVar101._8_4_ + 2.0) * 0.125;
      auVar40._12_4_ = (auVar101._12_4_ + 3.0) * 0.125;
      auVar40._16_4_ = (auVar101._16_4_ + 4.0) * 0.125;
      auVar40._20_4_ = (auVar101._20_4_ + 5.0) * 0.125;
      auVar40._24_4_ = (auVar101._24_4_ + 6.0) * 0.125;
      auVar40._28_4_ = auVar101._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar40,auVar240,auVar213);
      auVar41._4_4_ = auVar81._4_4_ * auVar81._4_4_;
      auVar41._0_4_ = auVar81._0_4_ * auVar81._0_4_;
      auVar41._8_4_ = auVar81._8_4_ * auVar81._8_4_;
      auVar41._12_4_ = auVar81._12_4_ * auVar81._12_4_;
      auVar41._16_4_ = auVar81._16_4_ * auVar81._16_4_;
      auVar41._20_4_ = auVar81._20_4_ * auVar81._20_4_;
      auVar41._24_4_ = auVar81._24_4_ * auVar81._24_4_;
      auVar41._28_4_ = auVar81._28_4_;
      auVar101 = vsubps_avx(local_780,auVar41);
      auVar42._4_4_ = auVar101._4_4_ * (float)local_580._4_4_;
      auVar42._0_4_ = auVar101._0_4_ * (float)local_580._0_4_;
      auVar42._8_4_ = auVar101._8_4_ * fStack_578;
      auVar42._12_4_ = auVar101._12_4_ * fStack_574;
      auVar42._16_4_ = auVar101._16_4_ * fStack_570;
      auVar42._20_4_ = auVar101._20_4_ * fStack_56c;
      auVar42._24_4_ = auVar101._24_4_ * fStack_568;
      auVar42._28_4_ = auVar81._28_4_;
      auVar81 = vsubps_avx(local_560,auVar42);
      uVar14 = vcmpps_avx512vl(auVar81,ZEXT1232(auVar47) << 0x20,5);
      bVar54 = (byte)uVar14;
      if (bVar54 == 0) {
        bVar54 = 0;
        auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar224 = ZEXT864(0) << 0x20;
        auVar81 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar245 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar128._8_4_ = 0x7f800000;
        auVar128._0_8_ = 0x7f8000007f800000;
        auVar128._12_4_ = 0x7f800000;
        auVar128._16_4_ = 0x7f800000;
        auVar128._20_4_ = 0x7f800000;
        auVar128._24_4_ = 0x7f800000;
        auVar128._28_4_ = 0x7f800000;
        auVar129._8_4_ = 0xff800000;
        auVar129._0_8_ = 0xff800000ff800000;
        auVar129._12_4_ = 0xff800000;
        auVar129._16_4_ = 0xff800000;
        auVar129._20_4_ = 0xff800000;
        auVar129._24_4_ = 0xff800000;
        auVar129._28_4_ = 0xff800000;
      }
      else {
        auVar75 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
        uVar69 = vcmpps_avx512vl(auVar81,auVar119,5);
        auVar81 = vsqrtps_avx(auVar81);
        auVar102 = vfnmadd213ps_avx512vl(auVar115,local_600,auVar122);
        auVar106 = vfmadd132ps_avx512vl(auVar102,local_600,local_600);
        auVar102 = vsubps_avx(local_5a0,auVar81);
        auVar107 = vmulps_avx512vl(auVar102,auVar106);
        auVar81 = vsubps_avx512vl(auVar81,auVar117);
        auVar106 = vmulps_avx512vl(auVar81,auVar106);
        auVar81 = vfmadd213ps_avx512vl(auVar116,auVar107,auVar105);
        auVar43._4_4_ = fVar168 * auVar81._4_4_;
        auVar43._0_4_ = fVar155 * auVar81._0_4_;
        auVar43._8_4_ = fVar169 * auVar81._8_4_;
        auVar43._12_4_ = fVar170 * auVar81._12_4_;
        auVar43._16_4_ = fVar172 * auVar81._16_4_;
        auVar43._20_4_ = fVar171 * auVar81._20_4_;
        auVar43._24_4_ = fVar201 * auVar81._24_4_;
        auVar43._28_4_ = auVar103._28_4_;
        auVar44._4_4_ = (float)local_520._4_4_ * auVar107._4_4_;
        auVar44._0_4_ = (float)local_520._0_4_ * auVar107._0_4_;
        auVar44._8_4_ = fStack_518 * auVar107._8_4_;
        auVar44._12_4_ = fStack_514 * auVar107._12_4_;
        auVar44._16_4_ = fStack_510 * auVar107._16_4_;
        auVar44._20_4_ = fStack_50c * auVar107._20_4_;
        auVar44._24_4_ = fStack_508 * auVar107._24_4_;
        auVar44._28_4_ = auVar81._28_4_;
        auVar102 = vmulps_avx512vl(local_540,auVar107);
        auVar108 = vmulps_avx512vl(local_620,auVar107);
        auVar81 = vfmadd213ps_avx512vl(auVar96,auVar43,auVar220);
        auVar81 = vsubps_avx512vl(auVar44,auVar81);
        auVar103 = vfmadd213ps_avx512vl(auVar97,auVar43,auVar99);
        auVar103 = vsubps_avx512vl(auVar102,auVar103);
        auVar74 = vfmadd213ps_fma(auVar43,auVar98,auVar100);
        auVar102 = vsubps_avx(auVar108,ZEXT1632(auVar74));
        auVar245 = auVar102._0_28_;
        auVar102 = vfmadd213ps_avx512vl(auVar116,auVar106,auVar105);
        auVar104 = vmulps_avx512vl(auVar104,auVar102);
        auVar45._4_4_ = (float)local_520._4_4_ * auVar106._4_4_;
        auVar45._0_4_ = (float)local_520._0_4_ * auVar106._0_4_;
        auVar45._8_4_ = fStack_518 * auVar106._8_4_;
        auVar45._12_4_ = fStack_514 * auVar106._12_4_;
        auVar45._16_4_ = fStack_510 * auVar106._16_4_;
        auVar45._20_4_ = fStack_50c * auVar106._20_4_;
        auVar45._24_4_ = fStack_508 * auVar106._24_4_;
        auVar45._28_4_ = auVar108._28_4_;
        auVar105 = vmulps_avx512vl(local_540,auVar106);
        auVar108 = vmulps_avx512vl(local_620,auVar106);
        auVar74 = vfmadd213ps_fma(auVar96,auVar104,auVar220);
        auVar102 = vsubps_avx(auVar45,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar97,auVar104,auVar99);
        auVar96 = vsubps_avx512vl(auVar105,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar98,auVar104,auVar100);
        auVar97 = vsubps_avx512vl(auVar108,ZEXT1632(auVar74));
        auVar224 = ZEXT3264(auVar97);
        auVar197._8_4_ = 0x7f800000;
        auVar197._0_8_ = 0x7f8000007f800000;
        auVar197._12_4_ = 0x7f800000;
        auVar197._16_4_ = 0x7f800000;
        auVar197._20_4_ = 0x7f800000;
        auVar197._24_4_ = 0x7f800000;
        auVar197._28_4_ = 0x7f800000;
        auVar97 = vblendmps_avx512vl(auVar197,auVar107);
        bVar67 = (bool)((byte)uVar69 & 1);
        auVar128._0_4_ = (uint)bVar67 * auVar97._0_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar67 * auVar97._4_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar67 * auVar97._8_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar67 * auVar97._12_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar128._16_4_ = (uint)bVar67 * auVar97._16_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar128._20_4_ = (uint)bVar67 * auVar97._20_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar128._24_4_ = (uint)bVar67 * auVar97._24_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = SUB81(uVar69 >> 7,0);
        auVar128._28_4_ = (uint)bVar67 * auVar97._28_4_ | (uint)!bVar67 * 0x7f800000;
        auVar221._8_4_ = 0xff800000;
        auVar221._0_8_ = 0xff800000ff800000;
        auVar221._12_4_ = 0xff800000;
        auVar221._16_4_ = 0xff800000;
        auVar221._20_4_ = 0xff800000;
        auVar221._24_4_ = 0xff800000;
        auVar221._28_4_ = 0xff800000;
        auVar97 = vblendmps_avx512vl(auVar221,auVar106);
        bVar67 = (bool)((byte)uVar69 & 1);
        auVar129._0_4_ = (uint)bVar67 * auVar97._0_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar67 * auVar97._4_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar67 * auVar97._8_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar67 * auVar97._12_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar129._16_4_ = (uint)bVar67 * auVar97._16_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar129._20_4_ = (uint)bVar67 * auVar97._20_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar129._24_4_ = (uint)bVar67 * auVar97._24_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = SUB81(uVar69 >> 7,0);
        auVar129._28_4_ = (uint)bVar67 * auVar97._28_4_ | (uint)!bVar67 * -0x800000;
        auVar29._8_4_ = 0x36000000;
        auVar29._0_8_ = 0x3600000036000000;
        auVar29._12_4_ = 0x36000000;
        auVar29._16_4_ = 0x36000000;
        auVar29._20_4_ = 0x36000000;
        auVar29._24_4_ = 0x36000000;
        auVar29._28_4_ = 0x36000000;
        auVar97 = vmulps_avx512vl(local_5c0,auVar29);
        uVar62 = vcmpps_avx512vl(auVar97,local_5e0,0xe);
        uVar69 = uVar69 & uVar62;
        bVar57 = (byte)uVar69;
        if (bVar57 != 0) {
          uVar62 = vcmpps_avx512vl(auVar101,ZEXT1632(auVar75),2);
          auVar241._8_4_ = 0x7f800000;
          auVar241._0_8_ = 0x7f8000007f800000;
          auVar241._12_4_ = 0x7f800000;
          auVar241._16_4_ = 0x7f800000;
          auVar241._20_4_ = 0x7f800000;
          auVar241._24_4_ = 0x7f800000;
          auVar241._28_4_ = 0x7f800000;
          auVar243._8_4_ = 0xff800000;
          auVar243._0_8_ = 0xff800000ff800000;
          auVar243._12_4_ = 0xff800000;
          auVar243._16_4_ = 0xff800000;
          auVar243._20_4_ = 0xff800000;
          auVar243._24_4_ = 0xff800000;
          auVar243._28_4_ = 0xff800000;
          auVar98 = vblendmps_avx512vl(auVar241,auVar243);
          bVar64 = (byte)uVar62;
          uVar61 = (uint)(bVar64 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar97._0_4_;
          bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
          uVar56 = (uint)bVar67 * auVar98._4_4_ | (uint)!bVar67 * auVar97._4_4_;
          bVar67 = (bool)((byte)(uVar62 >> 2) & 1);
          uVar135 = (uint)bVar67 * auVar98._8_4_ | (uint)!bVar67 * auVar97._8_4_;
          bVar67 = (bool)((byte)(uVar62 >> 3) & 1);
          uVar136 = (uint)bVar67 * auVar98._12_4_ | (uint)!bVar67 * auVar97._12_4_;
          bVar67 = (bool)((byte)(uVar62 >> 4) & 1);
          uVar137 = (uint)bVar67 * auVar98._16_4_ | (uint)!bVar67 * auVar97._16_4_;
          bVar67 = (bool)((byte)(uVar62 >> 5) & 1);
          uVar138 = (uint)bVar67 * auVar98._20_4_ | (uint)!bVar67 * auVar97._20_4_;
          bVar67 = (bool)((byte)(uVar62 >> 6) & 1);
          uVar139 = (uint)bVar67 * auVar98._24_4_ | (uint)!bVar67 * auVar97._24_4_;
          bVar67 = SUB81(uVar62 >> 7,0);
          uVar140 = (uint)bVar67 * auVar98._28_4_ | (uint)!bVar67 * auVar97._28_4_;
          auVar128._0_4_ = (bVar57 & 1) * uVar61 | !(bool)(bVar57 & 1) * auVar128._0_4_;
          bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar128._4_4_ = bVar67 * uVar56 | !bVar67 * auVar128._4_4_;
          bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar128._8_4_ = bVar67 * uVar135 | !bVar67 * auVar128._8_4_;
          bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar128._12_4_ = bVar67 * uVar136 | !bVar67 * auVar128._12_4_;
          bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar128._16_4_ = bVar67 * uVar137 | !bVar67 * auVar128._16_4_;
          bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar128._20_4_ = bVar67 * uVar138 | !bVar67 * auVar128._20_4_;
          bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar128._24_4_ = bVar67 * uVar139 | !bVar67 * auVar128._24_4_;
          bVar67 = SUB81(uVar69 >> 7,0);
          auVar128._28_4_ = bVar67 * uVar140 | !bVar67 * auVar128._28_4_;
          auVar97 = vblendmps_avx512vl(auVar243,auVar241);
          bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar62 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar62 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar62 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
          bVar10 = SUB81(uVar62 >> 7,0);
          auVar129._0_4_ =
               (uint)(bVar57 & 1) *
               ((uint)(bVar64 & 1) * auVar97._0_4_ | !(bool)(bVar64 & 1) * uVar61) |
               !(bool)(bVar57 & 1) * auVar129._0_4_;
          bVar4 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar129._4_4_ =
               (uint)bVar4 * ((uint)bVar67 * auVar97._4_4_ | !bVar67 * uVar56) |
               !bVar4 * auVar129._4_4_;
          bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar129._8_4_ =
               (uint)bVar67 * ((uint)bVar5 * auVar97._8_4_ | !bVar5 * uVar135) |
               !bVar67 * auVar129._8_4_;
          bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar129._12_4_ =
               (uint)bVar67 * ((uint)bVar6 * auVar97._12_4_ | !bVar6 * uVar136) |
               !bVar67 * auVar129._12_4_;
          bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar129._16_4_ =
               (uint)bVar67 * ((uint)bVar7 * auVar97._16_4_ | !bVar7 * uVar137) |
               !bVar67 * auVar129._16_4_;
          bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar129._20_4_ =
               (uint)bVar67 * ((uint)bVar8 * auVar97._20_4_ | !bVar8 * uVar138) |
               !bVar67 * auVar129._20_4_;
          bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar129._24_4_ =
               (uint)bVar67 * ((uint)bVar9 * auVar97._24_4_ | !bVar9 * uVar139) |
               !bVar67 * auVar129._24_4_;
          bVar67 = SUB81(uVar69 >> 7,0);
          auVar129._28_4_ =
               (uint)bVar67 * ((uint)bVar10 * auVar97._28_4_ | !bVar10 * uVar140) |
               !bVar67 * auVar129._28_4_;
          bVar54 = (~bVar57 | bVar64) & bVar54;
        }
      }
      auVar233._0_4_ = local_620._0_4_ * auVar224._0_4_;
      auVar233._4_4_ = local_620._4_4_ * auVar224._4_4_;
      auVar233._8_4_ = local_620._8_4_ * auVar224._8_4_;
      auVar233._12_4_ = local_620._12_4_ * auVar224._12_4_;
      auVar233._16_4_ = local_620._16_4_ * auVar224._16_4_;
      auVar233._20_4_ = local_620._20_4_ * auVar224._20_4_;
      auVar233._28_36_ = auVar224._28_36_;
      auVar233._24_4_ = local_620._24_4_ * auVar224._24_4_;
      auVar74 = vfmadd231ps_fma(auVar233._0_32_,local_540,auVar96);
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),_local_520,auVar102);
      auVar237._8_4_ = 0x7fffffff;
      auVar237._0_8_ = 0x7fffffff7fffffff;
      auVar237._12_4_ = 0x7fffffff;
      auVar237._16_4_ = 0x7fffffff;
      auVar237._20_4_ = 0x7fffffff;
      auVar237._24_4_ = 0x7fffffff;
      auVar237._28_4_ = 0x7fffffff;
      auVar96 = vandps_avx(ZEXT1632(auVar74),auVar237);
      _local_1c0 = auVar82;
      auVar232._8_4_ = 0x3e99999a;
      auVar232._0_8_ = 0x3e99999a3e99999a;
      auVar232._12_4_ = 0x3e99999a;
      auVar232._16_4_ = 0x3e99999a;
      auVar232._20_4_ = 0x3e99999a;
      auVar232._24_4_ = 0x3e99999a;
      auVar232._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar96,auVar232,1);
      local_500._0_2_ = (short)uVar14;
      local_320 = vmaxps_avx(auVar82,auVar129);
      auVar96 = vminps_avx(local_300,auVar128);
      uVar14 = vcmpps_avx512vl(auVar82,auVar96,2);
      bVar57 = (byte)uVar14 & bVar52;
      uVar15 = vcmpps_avx512vl(local_320,local_300,2);
      if ((bVar52 & ((byte)uVar15 | (byte)uVar14)) == 0) {
        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar224 = ZEXT3264(local_6c0);
      }
      else {
        auVar46._4_4_ = local_620._4_4_ * auVar245._4_4_;
        auVar46._0_4_ = local_620._0_4_ * auVar245._0_4_;
        auVar46._8_4_ = local_620._8_4_ * auVar245._8_4_;
        auVar46._12_4_ = local_620._12_4_ * auVar245._12_4_;
        auVar46._16_4_ = local_620._16_4_ * auVar245._16_4_;
        auVar46._20_4_ = local_620._20_4_ * auVar245._20_4_;
        auVar46._24_4_ = local_620._24_4_ * auVar245._24_4_;
        auVar46._28_4_ = auVar96._28_4_;
        auVar74 = vfmadd213ps_fma(auVar103,local_540,auVar46);
        auVar74 = vfmadd213ps_fma(auVar81,_local_520,ZEXT1632(auVar74));
        auVar81 = vandps_avx(ZEXT1632(auVar74),auVar237);
        uVar14 = vcmpps_avx512vl(auVar81,auVar232,1);
        bVar64 = (byte)uVar14 | ~bVar54;
        auVar150._8_4_ = 2;
        auVar150._0_8_ = 0x200000002;
        auVar150._12_4_ = 2;
        auVar150._16_4_ = 2;
        auVar150._20_4_ = 2;
        auVar150._24_4_ = 2;
        auVar150._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar81 = vpblendmd_avx512vl(auVar150,auVar30);
        local_2c0._0_4_ = (uint)(bVar64 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        local_2c0._4_4_ = (uint)bVar67 * auVar81._4_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        local_2c0._8_4_ = (uint)bVar67 * auVar81._8_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        local_2c0._12_4_ = (uint)bVar67 * auVar81._12_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        local_2c0._16_4_ = (uint)bVar67 * auVar81._16_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        local_2c0._20_4_ = (uint)bVar67 * auVar81._20_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        local_2c0._24_4_ = (uint)bVar67 * auVar81._24_4_ | (uint)!bVar67 * 2;
        local_2c0._28_4_ = (uint)(bVar64 >> 7) * auVar81._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
        local_4a0 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_4a0,local_2c0,5);
        bVar64 = (byte)uVar14 & bVar57;
        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        if (bVar64 == 0) {
          auVar152._4_4_ = uVar70;
          auVar152._0_4_ = uVar70;
          auVar152._8_4_ = uVar70;
          auVar152._12_4_ = uVar70;
          auVar152._16_4_ = uVar70;
          auVar152._20_4_ = uVar70;
          auVar152._24_4_ = uVar70;
          auVar152._28_4_ = uVar70;
          auVar81 = local_320;
        }
        else {
          local_2e0 = local_320;
          auVar75 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar74 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar71 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar76 = vminps_avx(auVar75,auVar71);
          auVar75 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar71 = vmaxps_avx(auVar74,auVar75);
          auVar175._8_4_ = 0x7fffffff;
          auVar175._0_8_ = 0x7fffffff7fffffff;
          auVar175._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar76,auVar175);
          auVar75 = vandps_avx(auVar71,auVar175);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar75 = vmovshdup_avx(auVar74);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          fVar155 = auVar74._0_4_ * 1.9073486e-06;
          local_710 = vshufps_avx(auVar71,auVar71,0xff);
          local_a80 = auVar82._0_4_;
          fStack_a7c = auVar82._4_4_;
          fStack_a78 = auVar82._8_4_;
          fStack_a74 = auVar82._12_4_;
          fStack_a70 = auVar82._16_4_;
          fStack_a6c = auVar82._20_4_;
          fStack_a68 = auVar82._24_4_;
          fStack_a64 = auVar82._28_4_;
          local_4e0 = local_a80 + fVar141;
          fStack_4dc = fStack_a7c + fVar141;
          fStack_4d8 = fStack_a78 + fVar141;
          fStack_4d4 = fStack_a74 + fVar141;
          fStack_4d0 = fStack_a70 + fVar141;
          fStack_4cc = fStack_a6c + fVar141;
          fStack_4c8 = fStack_a68 + fVar141;
          fStack_4c4 = fStack_a64 + fVar141;
          do {
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar81 = vblendmps_avx512vl(auVar151,auVar82);
            auVar131._0_4_ =
                 (uint)(bVar64 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 1 & 1);
            auVar131._4_4_ = (uint)bVar67 * auVar81._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 2 & 1);
            auVar131._8_4_ = (uint)bVar67 * auVar81._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 3 & 1);
            auVar131._12_4_ = (uint)bVar67 * auVar81._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 4 & 1);
            auVar131._16_4_ = (uint)bVar67 * auVar81._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 5 & 1);
            auVar131._20_4_ = (uint)bVar67 * auVar81._20_4_ | (uint)!bVar67 * 0x7f800000;
            auVar131._24_4_ =
                 (uint)(bVar64 >> 6) * auVar81._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar81 = vshufps_avx(auVar131,auVar131,0xb1);
            auVar81 = vminps_avx(auVar131,auVar81);
            auVar96 = vshufpd_avx(auVar81,auVar81,5);
            auVar81 = vminps_avx(auVar81,auVar96);
            auVar96 = vpermpd_avx2(auVar81,0x4e);
            auVar81 = vminps_avx(auVar81,auVar96);
            uVar14 = vcmpps_avx512vl(auVar131,auVar81,0);
            bVar53 = (byte)uVar14 & bVar64;
            bVar55 = bVar64;
            if (bVar53 != 0) {
              bVar55 = bVar53;
            }
            iVar17 = 0;
            for (uVar70 = (uint)bVar55; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            uVar70 = *(uint *)(local_1e0 + (uint)(iVar17 << 2));
            uVar61 = *(uint *)(local_1c0 + (uint)(iVar17 << 2));
            fVar168 = auVar12._0_4_;
            if ((float)local_7c0._0_4_ < 0.0) {
              fVar168 = sqrtf((float)local_7c0._0_4_);
            }
            auVar74 = vinsertps_avx(ZEXT416(uVar61),ZEXT416(uVar70),0x10);
            bVar67 = true;
            uVar69 = 0;
            do {
              uVar156 = auVar74._0_4_;
              auVar142._4_4_ = uVar156;
              auVar142._0_4_ = uVar156;
              auVar142._8_4_ = uVar156;
              auVar142._12_4_ = uVar156;
              auVar71 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_7b0);
              auVar75 = vmovshdup_avx(auVar74);
              local_5a0._0_16_ = auVar75;
              fVar201 = 1.0 - auVar75._0_4_;
              auVar75 = vshufps_avx(auVar74,auVar74,0x55);
              fVar169 = auVar75._0_4_;
              auVar176._0_4_ = local_680._0_4_ * fVar169;
              fVar170 = auVar75._4_4_;
              auVar176._4_4_ = local_680._4_4_ * fVar170;
              fVar172 = auVar75._8_4_;
              auVar176._8_4_ = local_680._8_4_ * fVar172;
              fVar171 = auVar75._12_4_;
              auVar176._12_4_ = local_680._12_4_ * fVar171;
              _local_580 = ZEXT416((uint)fVar201);
              auVar203._4_4_ = fVar201;
              auVar203._0_4_ = fVar201;
              auVar203._8_4_ = fVar201;
              auVar203._12_4_ = fVar201;
              auVar75 = vfmadd231ps_fma(auVar176,auVar203,local_640._0_16_);
              auVar216._0_4_ = local_660._0_4_ * fVar169;
              auVar216._4_4_ = local_660._4_4_ * fVar170;
              auVar216._8_4_ = local_660._8_4_ * fVar172;
              auVar216._12_4_ = local_660._12_4_ * fVar171;
              auVar76 = vfmadd231ps_fma(auVar216,auVar203,local_680._0_16_);
              auVar226._0_4_ = fVar169 * (float)local_6a0._0_4_;
              auVar226._4_4_ = fVar170 * (float)local_6a0._4_4_;
              auVar226._8_4_ = fVar172 * fStack_698;
              auVar226._12_4_ = fVar171 * fStack_694;
              auVar77 = vfmadd231ps_fma(auVar226,auVar203,local_660._0_16_);
              auVar235._0_4_ = fVar169 * auVar76._0_4_;
              auVar235._4_4_ = fVar170 * auVar76._4_4_;
              auVar235._8_4_ = fVar172 * auVar76._8_4_;
              auVar235._12_4_ = fVar171 * auVar76._12_4_;
              auVar75 = vfmadd231ps_fma(auVar235,auVar203,auVar75);
              auVar177._0_4_ = fVar169 * auVar77._0_4_;
              auVar177._4_4_ = fVar170 * auVar77._4_4_;
              auVar177._8_4_ = fVar172 * auVar77._8_4_;
              auVar177._12_4_ = fVar171 * auVar77._12_4_;
              auVar76 = vfmadd231ps_fma(auVar177,auVar203,auVar76);
              auVar217._0_4_ = fVar169 * auVar76._0_4_;
              auVar217._4_4_ = fVar170 * auVar76._4_4_;
              auVar217._8_4_ = fVar172 * auVar76._8_4_;
              auVar217._12_4_ = fVar171 * auVar76._12_4_;
              auVar77 = vfmadd231ps_fma(auVar217,auVar75,auVar203);
              auVar75 = vsubps_avx(auVar76,auVar75);
              auVar18._8_4_ = 0x40400000;
              auVar18._0_8_ = 0x4040000040400000;
              auVar18._12_4_ = 0x40400000;
              auVar76 = vmulps_avx512vl(auVar75,auVar18);
              local_560._0_16_ = auVar77;
              auVar71 = vsubps_avx(auVar71,auVar77);
              auVar75 = vdpps_avx(auVar71,auVar71,0x7f);
              fVar169 = auVar75._0_4_;
              local_780 = ZEXT1632(auVar74);
              if (fVar169 < 0.0) {
                auVar224._0_4_ = sqrtf(fVar169);
                auVar224._4_60_ = extraout_var;
                auVar74 = auVar224._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar75,auVar75);
              }
              local_5c0._0_16_ = vdpps_avx(auVar76,auVar76,0x7f);
              fVar170 = local_5c0._0_4_;
              auVar178._4_12_ = ZEXT812(0) << 0x20;
              auVar178._0_4_ = fVar170;
              local_7e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              fVar172 = local_7e0._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar72 = vxorps_avx512vl(local_5c0._0_16_,auVar19);
              auVar77 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar77._0_4_;
              local_7a0._0_4_ = auVar74._0_4_;
              if (fVar170 < auVar72._0_4_) {
                fVar171 = sqrtf(fVar170);
                auVar74 = ZEXT416((uint)local_7a0._0_4_);
              }
              else {
                auVar77 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar171 = auVar77._0_4_;
              }
              fVar201 = local_7e0._0_4_;
              fVar170 = fVar172 * 1.5 + fVar170 * -0.5 * fVar201 * fVar201 * fVar201;
              auVar143._0_4_ = auVar76._0_4_ * fVar170;
              auVar143._4_4_ = auVar76._4_4_ * fVar170;
              auVar143._8_4_ = auVar76._8_4_ * fVar170;
              auVar143._12_4_ = auVar76._12_4_ * fVar170;
              local_7e0._0_16_ = vdpps_avx(auVar71,auVar143,0x7f);
              auVar72 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
              auVar144._0_4_ = local_7e0._0_4_ * local_7e0._0_4_;
              auVar144._4_4_ = local_7e0._4_4_ * local_7e0._4_4_;
              auVar144._8_4_ = local_7e0._8_4_ * local_7e0._8_4_;
              auVar144._12_4_ = local_7e0._12_4_ * local_7e0._12_4_;
              auVar75 = vsubps_avx(auVar75,auVar144);
              fVar172 = auVar75._0_4_;
              auVar158._4_12_ = ZEXT812(0) << 0x20;
              auVar158._0_4_ = fVar172;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
              auVar78 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
              auVar79 = vmulss_avx512f(auVar75,ZEXT416(0xbf000000));
              uVar68 = fVar172 == 0.0;
              uVar66 = fVar172 < 0.0;
              if ((bool)uVar66) {
                local_6f0._0_4_ = auVar79._0_4_;
                local_700 = fVar170;
                fStack_6fc = fVar170;
                fStack_6f8 = fVar170;
                fStack_6f4 = fVar170;
                local_6e0 = auVar77;
                fVar172 = sqrtf(fVar172);
                auVar79 = ZEXT416((uint)local_6f0._0_4_);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar74 = ZEXT416((uint)local_7a0._0_4_);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar77 = local_6e0;
                fVar170 = local_700;
                fVar201 = fStack_6fc;
                fVar173 = fStack_6f8;
                fVar249 = fStack_6f4;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                fVar172 = auVar75._0_4_;
                fVar201 = fVar170;
                fVar173 = fVar170;
                fVar249 = fVar170;
              }
              auVar225 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_)
              ;
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar174 = auVar75._0_4_ * 6.0;
              fVar13 = local_5a0._0_4_ * 6.0;
              auVar204._0_4_ = fVar13 * (float)local_6a0._0_4_;
              auVar204._4_4_ = fVar13 * (float)local_6a0._4_4_;
              auVar204._8_4_ = fVar13 * fStack_698;
              auVar204._12_4_ = fVar13 * fStack_694;
              auVar179._4_4_ = fVar174;
              auVar179._0_4_ = fVar174;
              auVar179._8_4_ = fVar174;
              auVar179._12_4_ = fVar174;
              auVar75 = vfmadd132ps_fma(auVar179,auVar204,local_660._0_16_);
              fVar174 = auVar225._0_4_ * 6.0;
              auVar159._4_4_ = fVar174;
              auVar159._0_4_ = fVar174;
              auVar159._8_4_ = fVar174;
              auVar159._12_4_ = fVar174;
              auVar75 = vfmadd132ps_fma(auVar159,auVar75,local_680._0_16_);
              fVar174 = local_580._0_4_ * 6.0;
              auVar180._4_4_ = fVar174;
              auVar180._0_4_ = fVar174;
              auVar180._8_4_ = fVar174;
              auVar180._12_4_ = fVar174;
              auVar75 = vfmadd132ps_fma(auVar180,auVar75,local_640._0_16_);
              auVar160._0_4_ = auVar75._0_4_ * (float)local_5c0._0_4_;
              auVar160._4_4_ = auVar75._4_4_ * (float)local_5c0._0_4_;
              auVar160._8_4_ = auVar75._8_4_ * (float)local_5c0._0_4_;
              auVar160._12_4_ = auVar75._12_4_ * (float)local_5c0._0_4_;
              auVar75 = vdpps_avx(auVar76,auVar75,0x7f);
              fVar174 = auVar75._0_4_;
              auVar181._0_4_ = auVar76._0_4_ * fVar174;
              auVar181._4_4_ = auVar76._4_4_ * fVar174;
              auVar181._8_4_ = auVar76._8_4_ * fVar174;
              auVar181._12_4_ = auVar76._12_4_ * fVar174;
              auVar75 = vsubps_avx(auVar160,auVar181);
              fVar174 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar225 = vmaxss_avx(ZEXT416((uint)fVar155),
                                    ZEXT416((uint)(local_780._0_4_ * fVar168 * 1.9073486e-06)));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar76,auVar20);
              auVar182._0_4_ = fVar170 * auVar75._0_4_ * fVar174;
              auVar182._4_4_ = fVar201 * auVar75._4_4_ * fVar174;
              auVar182._8_4_ = fVar173 * auVar75._8_4_ * fVar174;
              auVar182._12_4_ = fVar249 * auVar75._12_4_ * fVar174;
              auVar75 = vdpps_avx(auVar80,auVar143,0x7f);
              auVar234 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar155),auVar225);
              auVar74 = vdpps_avx(auVar71,auVar182,0x7f);
              vfmadd213ss_avx512f(auVar72,ZEXT416((uint)(fVar155 / fVar171)),auVar234);
              fVar170 = auVar75._0_4_ + auVar74._0_4_;
              auVar74 = vdpps_avx(local_7b0,auVar143,0x7f);
              auVar75 = vdpps_avx(auVar71,auVar80,0x7f);
              auVar72 = vmulss_avx512f(auVar79,auVar77);
              auVar77 = vmulss_avx512f(auVar77,auVar77);
              auVar78 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar72._0_4_ * auVar77._0_4_)));
              auVar77 = vdpps_avx(auVar71,local_7b0,0x7f);
              auVar79 = vfnmadd231ss_avx512f(auVar75,local_7e0._0_16_,ZEXT416((uint)fVar170));
              auVar77 = vfnmadd231ss_avx512f(auVar77,local_7e0._0_16_,auVar74);
              auVar75 = vpermilps_avx(local_560._0_16_,0xff);
              fVar172 = fVar172 - auVar75._0_4_;
              auVar72 = vshufps_avx(auVar76,auVar76,0xff);
              auVar75 = vfmsub213ss_fma(auVar79,auVar78,auVar72);
              auVar238._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar238._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar238._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar77 = ZEXT416((uint)(auVar77._0_4_ * auVar78._0_4_));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)),
                                        ZEXT416((uint)fVar170),auVar77);
              auVar75 = vinsertps_avx(auVar238,auVar77,0x1c);
              auVar227._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar227._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar227._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar77 = vinsertps_avx(ZEXT416((uint)fVar170),auVar227,0x10);
              auVar205._0_4_ = auVar78._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar74 = vdivps_avx(auVar75,auVar205);
              auVar75 = vdivps_avx(auVar77,auVar205);
              auVar77 = vbroadcastss_avx512vl(local_7e0._0_16_);
              auVar206._0_4_ = auVar77._0_4_ * auVar74._0_4_ + fVar172 * auVar75._0_4_;
              auVar206._4_4_ = auVar77._4_4_ * auVar74._4_4_ + fVar172 * auVar75._4_4_;
              auVar206._8_4_ = auVar77._8_4_ * auVar74._8_4_ + fVar172 * auVar75._8_4_;
              auVar206._12_4_ = auVar77._12_4_ * auVar74._12_4_ + fVar172 * auVar75._12_4_;
              auVar74 = vsubps_avx(local_780._0_16_,auVar206);
              auVar21._8_4_ = 0x7fffffff;
              auVar21._0_8_ = 0x7fffffff7fffffff;
              auVar21._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(local_7e0._0_16_,auVar21);
              auVar75 = vucomiss_avx512f(auVar75);
              if (!(bool)uVar66 && !(bool)uVar68) {
                auVar75 = vaddss_avx512f(auVar225,auVar75);
                auVar75 = vfmadd231ss_fma(auVar75,local_710,ZEXT416(0x36000000));
                auVar22._8_4_ = 0x7fffffff;
                auVar22._0_8_ = 0x7fffffff7fffffff;
                auVar22._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(ZEXT416((uint)fVar172),auVar22);
                if (auVar77._0_4_ < auVar75._0_4_) {
                  fVar168 = auVar74._0_4_ + (float)local_720._0_4_;
                  auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar168 < fVar202) {
LAB_01d4ef84:
                    bVar55 = 0;
                    goto LAB_01d4efac;
                  }
                  fVar170 = *(float *)(ray + k * 4 + 0x100);
                  if (fVar168 <= fVar170) {
                    auVar75 = vmovshdup_avx(auVar74);
                    bVar55 = 0;
                    if ((auVar75._0_4_ < 0.0) || (1.0 < auVar75._0_4_)) goto LAB_01d4efac;
                    auVar207._0_12_ = ZEXT812(0);
                    auVar207._12_4_ = 0;
                    auVar183._4_8_ = auVar207._4_8_;
                    auVar183._0_4_ = fVar169;
                    auVar183._12_4_ = 0;
                    auVar75 = vrsqrt14ss_avx512f(auVar207,auVar183);
                    fVar172 = auVar75._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar65].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01d4ef84;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar55 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01d4efac;
                    fVar169 = fVar172 * 1.5 + fVar169 * -0.5 * fVar172 * fVar172 * fVar172;
                    auVar184._0_4_ = auVar71._0_4_ * fVar169;
                    auVar184._4_4_ = auVar71._4_4_ * fVar169;
                    auVar184._8_4_ = auVar71._8_4_ * fVar169;
                    auVar184._12_4_ = auVar71._12_4_ * fVar169;
                    auVar77 = vfmadd213ps_fma(auVar72,auVar184,auVar76);
                    auVar75 = vshufps_avx(auVar184,auVar184,0xc9);
                    auVar71 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar185._0_4_ = auVar184._0_4_ * auVar71._0_4_;
                    auVar185._4_4_ = auVar184._4_4_ * auVar71._4_4_;
                    auVar185._8_4_ = auVar184._8_4_ * auVar71._8_4_;
                    auVar185._12_4_ = auVar184._12_4_ * auVar71._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar185,auVar76,auVar75);
                    auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                    auVar71 = vshufps_avx(auVar77,auVar77,0xc9);
                    auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                    auVar145._0_4_ = auVar77._0_4_ * auVar76._0_4_;
                    auVar145._4_4_ = auVar77._4_4_ * auVar76._4_4_;
                    auVar145._8_4_ = auVar77._8_4_ * auVar76._8_4_;
                    auVar145._12_4_ = auVar77._12_4_ * auVar76._12_4_;
                    auVar75 = vfmsub231ps_fma(auVar145,auVar75,auVar71);
                    auVar214._8_4_ = 1;
                    auVar214._0_8_ = 0x100000001;
                    auVar214._12_4_ = 1;
                    auVar214._16_4_ = 1;
                    auVar214._20_4_ = 1;
                    auVar214._24_4_ = 1;
                    auVar214._28_4_ = 1;
                    local_3e0 = vpermps_avx2(auVar214,ZEXT1632(auVar74));
                    auVar81 = vpermps_avx2(auVar214,ZEXT1632(auVar75));
                    auVar222._8_4_ = 2;
                    auVar222._0_8_ = 0x200000002;
                    auVar222._12_4_ = 2;
                    auVar222._16_4_ = 2;
                    auVar222._20_4_ = 2;
                    auVar222._24_4_ = 2;
                    auVar222._28_4_ = 2;
                    local_420 = vpermps_avx2(auVar222,ZEXT1632(auVar75));
                    local_400 = auVar75._0_4_;
                    local_440[0] = (RTCHitN)auVar81[0];
                    local_440[1] = (RTCHitN)auVar81[1];
                    local_440[2] = (RTCHitN)auVar81[2];
                    local_440[3] = (RTCHitN)auVar81[3];
                    local_440[4] = (RTCHitN)auVar81[4];
                    local_440[5] = (RTCHitN)auVar81[5];
                    local_440[6] = (RTCHitN)auVar81[6];
                    local_440[7] = (RTCHitN)auVar81[7];
                    local_440[8] = (RTCHitN)auVar81[8];
                    local_440[9] = (RTCHitN)auVar81[9];
                    local_440[10] = (RTCHitN)auVar81[10];
                    local_440[0xb] = (RTCHitN)auVar81[0xb];
                    local_440[0xc] = (RTCHitN)auVar81[0xc];
                    local_440[0xd] = (RTCHitN)auVar81[0xd];
                    local_440[0xe] = (RTCHitN)auVar81[0xe];
                    local_440[0xf] = (RTCHitN)auVar81[0xf];
                    local_440[0x10] = (RTCHitN)auVar81[0x10];
                    local_440[0x11] = (RTCHitN)auVar81[0x11];
                    local_440[0x12] = (RTCHitN)auVar81[0x12];
                    local_440[0x13] = (RTCHitN)auVar81[0x13];
                    local_440[0x14] = (RTCHitN)auVar81[0x14];
                    local_440[0x15] = (RTCHitN)auVar81[0x15];
                    local_440[0x16] = (RTCHitN)auVar81[0x16];
                    local_440[0x17] = (RTCHitN)auVar81[0x17];
                    local_440[0x18] = (RTCHitN)auVar81[0x18];
                    local_440[0x19] = (RTCHitN)auVar81[0x19];
                    local_440[0x1a] = (RTCHitN)auVar81[0x1a];
                    local_440[0x1b] = (RTCHitN)auVar81[0x1b];
                    local_440[0x1c] = (RTCHitN)auVar81[0x1c];
                    local_440[0x1d] = (RTCHitN)auVar81[0x1d];
                    local_440[0x1e] = (RTCHitN)auVar81[0x1e];
                    local_440[0x1f] = (RTCHitN)auVar81[0x1f];
                    uStack_3fc = local_400;
                    uStack_3f8 = local_400;
                    uStack_3f4 = local_400;
                    uStack_3f0 = local_400;
                    uStack_3ec = local_400;
                    uStack_3e8 = local_400;
                    uStack_3e4 = local_400;
                    local_3c0 = ZEXT432(0) << 0x20;
                    local_3a0 = local_460._0_8_;
                    uStack_398 = local_460._8_8_;
                    uStack_390 = local_460._16_8_;
                    uStack_388 = local_460._24_8_;
                    local_380 = local_480;
                    vpcmpeqd_avx2(local_480,local_480);
                    local_360 = context->user->instID[0];
                    uStack_35c = local_360;
                    uStack_358 = local_360;
                    uStack_354 = local_360;
                    uStack_350 = local_360;
                    uStack_34c = local_360;
                    uStack_348 = local_360;
                    uStack_344 = local_360;
                    local_340 = context->user->instPrimID[0];
                    uStack_33c = local_340;
                    uStack_338 = local_340;
                    uStack_334 = local_340;
                    uStack_330 = local_340;
                    uStack_32c = local_340;
                    uStack_328 = local_340;
                    uStack_324 = local_340;
                    *(float *)(ray + k * 4 + 0x100) = fVar168;
                    local_760 = local_4c0;
                    local_810.valid = (int *)local_760;
                    local_810.geometryUserPtr = pGVar2->userPtr;
                    local_810.context = context->user;
                    local_810.hit = local_440;
                    local_810.N = 8;
                    local_810.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar2->occlusionFilterN)(&local_810);
                      auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                    }
                    if (local_760 != (undefined1  [32])0x0) {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var3)(&local_810);
                        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      }
                      uVar69 = vptestmd_avx512vl(local_760,local_760);
                      auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar4 = (bool)((byte)uVar69 & 1);
                      bVar5 = (bool)((byte)(uVar69 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar69 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar69 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar69 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar69 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
                      bVar11 = SUB81(uVar69 >> 7,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)bVar4 * auVar81._0_4_ |
                           (uint)!bVar4 * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar5 * auVar81._4_4_ |
                           (uint)!bVar5 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar6 * auVar81._8_4_ |
                           (uint)!bVar6 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar7 * auVar81._12_4_ |
                           (uint)!bVar7 * *(int *)(local_810.ray + 0x10c);
                      *(uint *)(local_810.ray + 0x110) =
                           (uint)bVar8 * auVar81._16_4_ |
                           (uint)!bVar8 * *(int *)(local_810.ray + 0x110);
                      *(uint *)(local_810.ray + 0x114) =
                           (uint)bVar9 * auVar81._20_4_ |
                           (uint)!bVar9 * *(int *)(local_810.ray + 0x114);
                      *(uint *)(local_810.ray + 0x118) =
                           (uint)bVar10 * auVar81._24_4_ |
                           (uint)!bVar10 * *(int *)(local_810.ray + 0x118);
                      *(uint *)(local_810.ray + 0x11c) =
                           (uint)bVar11 * auVar81._28_4_ |
                           (uint)!bVar11 * *(int *)(local_810.ray + 0x11c);
                      bVar55 = 1;
                      if (local_760 != (undefined1  [32])0x0) goto LAB_01d4efac;
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar170;
                  }
                  bVar55 = 0;
                  goto LAB_01d4efac;
                }
              }
              bVar67 = uVar69 < 4;
              uVar69 = uVar69 + 1;
            } while (uVar69 != 5);
            bVar67 = false;
            auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar55 = 5;
LAB_01d4efac:
            bVar63 = (bool)(bVar63 | bVar67 & bVar55);
            uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar152._4_4_ = uVar156;
            auVar152._0_4_ = uVar156;
            auVar152._8_4_ = uVar156;
            auVar152._12_4_ = uVar156;
            auVar152._16_4_ = uVar156;
            auVar152._20_4_ = uVar156;
            auVar152._24_4_ = uVar156;
            auVar152._28_4_ = uVar156;
            auVar48._4_4_ = fStack_4dc;
            auVar48._0_4_ = local_4e0;
            auVar48._8_4_ = fStack_4d8;
            auVar48._12_4_ = fStack_4d4;
            auVar48._16_4_ = fStack_4d0;
            auVar48._20_4_ = fStack_4cc;
            auVar48._24_4_ = fStack_4c8;
            auVar48._28_4_ = fStack_4c4;
            uVar14 = vcmpps_avx512vl(auVar152,auVar48,0xd);
            bVar64 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar64 & (byte)uVar14;
            auVar81 = local_2e0;
          } while (bVar64 != 0);
        }
        auVar82 = local_320;
        bVar54 = local_500[0] | ~bVar54;
        auVar166._0_4_ = fVar141 + auVar81._0_4_;
        auVar166._4_4_ = fVar141 + auVar81._4_4_;
        auVar166._8_4_ = fVar141 + auVar81._8_4_;
        auVar166._12_4_ = fVar141 + auVar81._12_4_;
        auVar166._16_4_ = fVar141 + auVar81._16_4_;
        auVar166._20_4_ = fVar141 + auVar81._20_4_;
        auVar166._24_4_ = fVar141 + auVar81._24_4_;
        auVar166._28_4_ = fVar141 + auVar81._28_4_;
        uVar14 = vcmpps_avx512vl(auVar166,auVar152,2);
        bVar52 = (byte)uVar15 & bVar52 & (byte)uVar14;
        auVar167._8_4_ = 2;
        auVar167._0_8_ = 0x200000002;
        auVar167._12_4_ = 2;
        auVar167._16_4_ = 2;
        auVar167._20_4_ = 2;
        auVar167._24_4_ = 2;
        auVar167._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar81 = vpblendmd_avx512vl(auVar167,auVar31);
        auVar132._0_4_ = (uint)(bVar54 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar54 & 1) * 2;
        bVar67 = (bool)(bVar54 >> 1 & 1);
        auVar132._4_4_ = (uint)bVar67 * auVar81._4_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar54 >> 2 & 1);
        auVar132._8_4_ = (uint)bVar67 * auVar81._8_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar54 >> 3 & 1);
        auVar132._12_4_ = (uint)bVar67 * auVar81._12_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar54 >> 4 & 1);
        auVar132._16_4_ = (uint)bVar67 * auVar81._16_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar54 >> 5 & 1);
        auVar132._20_4_ = (uint)bVar67 * auVar81._20_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar54 >> 6 & 1);
        auVar132._24_4_ = (uint)bVar67 * auVar81._24_4_ | (uint)!bVar67 * 2;
        auVar132._28_4_ = (uint)(bVar54 >> 7) * auVar81._28_4_ | (uint)!(bool)(bVar54 >> 7) * 2;
        uVar14 = vpcmpd_avx512vl(local_4a0,auVar132,5);
        bVar54 = (byte)uVar14 & bVar52;
        if (bVar54 != 0) {
          auVar75 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar74 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar71 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar76 = vminps_avx(auVar75,auVar71);
          auVar75 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar71 = vmaxps_avx(auVar74,auVar75);
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar76,auVar186);
          auVar75 = vandps_avx(auVar71,auVar186);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar75 = vmovshdup_avx(auVar74);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          fVar155 = auVar74._0_4_ * 1.9073486e-06;
          local_710 = vshufps_avx(auVar71,auVar71,0xff);
          local_4e0 = fVar141 + local_320._0_4_;
          fStack_4dc = fVar141 + local_320._4_4_;
          fStack_4d8 = fVar141 + local_320._8_4_;
          fStack_4d4 = fVar141 + local_320._12_4_;
          fStack_4d0 = fVar141 + local_320._16_4_;
          fStack_4cc = fVar141 + local_320._20_4_;
          fStack_4c8 = fVar141 + local_320._24_4_;
          fStack_4c4 = fVar141 + local_320._28_4_;
          local_500 = auVar132;
          do {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar81 = vblendmps_avx512vl(auVar153,auVar82);
            auVar133._0_4_ =
                 (uint)(bVar54 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar54 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar54 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar67 * auVar81._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar54 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar67 * auVar81._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar54 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar67 * auVar81._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar54 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar67 * auVar81._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar54 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar67 * auVar81._20_4_ | (uint)!bVar67 * 0x7f800000;
            auVar133._24_4_ =
                 (uint)(bVar54 >> 6) * auVar81._24_4_ | (uint)!(bool)(bVar54 >> 6) * 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar81 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar81 = vminps_avx(auVar133,auVar81);
            auVar96 = vshufpd_avx(auVar81,auVar81,5);
            auVar81 = vminps_avx(auVar81,auVar96);
            auVar96 = vpermpd_avx2(auVar81,0x4e);
            auVar81 = vminps_avx(auVar81,auVar96);
            uVar14 = vcmpps_avx512vl(auVar133,auVar81,0);
            bVar55 = (byte)uVar14 & bVar54;
            bVar64 = bVar54;
            if (bVar55 != 0) {
              bVar64 = bVar55;
            }
            iVar17 = 0;
            for (uVar70 = (uint)bVar64; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            uVar70 = *(uint *)(local_200 + (uint)(iVar17 << 2));
            uVar61 = *(uint *)(local_300 + (uint)(iVar17 << 2));
            fVar168 = auVar73._0_4_;
            if ((float)local_7c0._0_4_ < 0.0) {
              fVar168 = sqrtf((float)local_7c0._0_4_);
            }
            auVar74 = vinsertps_avx(ZEXT416(uVar61),ZEXT416(uVar70),0x10);
            bVar67 = true;
            uVar69 = 0;
            do {
              uVar156 = auVar74._0_4_;
              auVar146._4_4_ = uVar156;
              auVar146._0_4_ = uVar156;
              auVar146._8_4_ = uVar156;
              auVar146._12_4_ = uVar156;
              auVar71 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_7b0);
              auVar75 = vmovshdup_avx(auVar74);
              local_5a0._0_16_ = auVar75;
              fVar201 = 1.0 - auVar75._0_4_;
              auVar75 = vshufps_avx(auVar74,auVar74,0x55);
              fVar169 = auVar75._0_4_;
              auVar187._0_4_ = local_680._0_4_ * fVar169;
              fVar170 = auVar75._4_4_;
              auVar187._4_4_ = local_680._4_4_ * fVar170;
              fVar172 = auVar75._8_4_;
              auVar187._8_4_ = local_680._8_4_ * fVar172;
              fVar171 = auVar75._12_4_;
              auVar187._12_4_ = local_680._12_4_ * fVar171;
              _local_580 = ZEXT416((uint)fVar201);
              auVar208._4_4_ = fVar201;
              auVar208._0_4_ = fVar201;
              auVar208._8_4_ = fVar201;
              auVar208._12_4_ = fVar201;
              auVar75 = vfmadd231ps_fma(auVar187,auVar208,local_640._0_16_);
              auVar218._0_4_ = local_660._0_4_ * fVar169;
              auVar218._4_4_ = local_660._4_4_ * fVar170;
              auVar218._8_4_ = local_660._8_4_ * fVar172;
              auVar218._12_4_ = local_660._12_4_ * fVar171;
              auVar76 = vfmadd231ps_fma(auVar218,auVar208,local_680._0_16_);
              auVar228._0_4_ = fVar169 * (float)local_6a0._0_4_;
              auVar228._4_4_ = fVar170 * (float)local_6a0._4_4_;
              auVar228._8_4_ = fVar172 * fStack_698;
              auVar228._12_4_ = fVar171 * fStack_694;
              auVar77 = vfmadd231ps_fma(auVar228,auVar208,local_660._0_16_);
              auVar236._0_4_ = fVar169 * auVar76._0_4_;
              auVar236._4_4_ = fVar170 * auVar76._4_4_;
              auVar236._8_4_ = fVar172 * auVar76._8_4_;
              auVar236._12_4_ = fVar171 * auVar76._12_4_;
              auVar75 = vfmadd231ps_fma(auVar236,auVar208,auVar75);
              auVar188._0_4_ = fVar169 * auVar77._0_4_;
              auVar188._4_4_ = fVar170 * auVar77._4_4_;
              auVar188._8_4_ = fVar172 * auVar77._8_4_;
              auVar188._12_4_ = fVar171 * auVar77._12_4_;
              auVar76 = vfmadd231ps_fma(auVar188,auVar208,auVar76);
              auVar219._0_4_ = fVar169 * auVar76._0_4_;
              auVar219._4_4_ = fVar170 * auVar76._4_4_;
              auVar219._8_4_ = fVar172 * auVar76._8_4_;
              auVar219._12_4_ = fVar171 * auVar76._12_4_;
              auVar77 = vfmadd231ps_fma(auVar219,auVar75,auVar208);
              auVar75 = vsubps_avx(auVar76,auVar75);
              auVar23._8_4_ = 0x40400000;
              auVar23._0_8_ = 0x4040000040400000;
              auVar23._12_4_ = 0x40400000;
              auVar76 = vmulps_avx512vl(auVar75,auVar23);
              local_560._0_16_ = auVar77;
              auVar71 = vsubps_avx(auVar71,auVar77);
              auVar75 = vdpps_avx(auVar71,auVar71,0x7f);
              fVar169 = auVar75._0_4_;
              local_780 = ZEXT1632(auVar74);
              if (fVar169 < 0.0) {
                auVar154._0_4_ = sqrtf(fVar169);
                auVar154._4_60_ = extraout_var_00;
                auVar74 = auVar154._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar75,auVar75);
              }
              local_5c0._0_16_ = vdpps_avx(auVar76,auVar76,0x7f);
              fVar170 = local_5c0._0_4_;
              auVar189._4_12_ = ZEXT812(0) << 0x20;
              auVar189._0_4_ = fVar170;
              local_7e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              fVar172 = local_7e0._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar72 = vxorps_avx512vl(local_5c0._0_16_,auVar24);
              auVar77 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar77._0_4_;
              local_7a0._0_4_ = auVar74._0_4_;
              if (fVar170 < auVar72._0_4_) {
                fVar171 = sqrtf(fVar170);
                auVar74 = ZEXT416((uint)local_7a0._0_4_);
              }
              else {
                auVar77 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar171 = auVar77._0_4_;
              }
              fVar201 = local_7e0._0_4_;
              fVar170 = fVar172 * 1.5 + fVar170 * -0.5 * fVar201 * fVar201 * fVar201;
              auVar248._0_4_ = auVar76._0_4_ * fVar170;
              auVar248._4_4_ = auVar76._4_4_ * fVar170;
              auVar248._8_4_ = auVar76._8_4_ * fVar170;
              auVar248._12_4_ = auVar76._12_4_ * fVar170;
              local_7e0._0_16_ = vdpps_avx(auVar71,auVar248,0x7f);
              auVar72 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
              auVar147._0_4_ = local_7e0._0_4_ * local_7e0._0_4_;
              auVar147._4_4_ = local_7e0._4_4_ * local_7e0._4_4_;
              auVar147._8_4_ = local_7e0._8_4_ * local_7e0._8_4_;
              auVar147._12_4_ = local_7e0._12_4_ * local_7e0._12_4_;
              auVar75 = vsubps_avx(auVar75,auVar147);
              fVar172 = auVar75._0_4_;
              auVar161._4_12_ = ZEXT812(0) << 0x20;
              auVar161._0_4_ = fVar172;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar161);
              auVar78 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
              auVar79 = vmulss_avx512f(auVar75,ZEXT416(0xbf000000));
              uVar68 = fVar172 == 0.0;
              uVar66 = fVar172 < 0.0;
              if ((bool)uVar66) {
                local_700 = auVar79._0_4_;
                local_6f0 = auVar248;
                local_6e0 = auVar77;
                fVar172 = sqrtf(fVar172);
                auVar79 = ZEXT416((uint)local_700);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar74 = ZEXT416((uint)local_7a0._0_4_);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar248 = local_6f0;
                auVar77 = local_6e0;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                fVar172 = auVar75._0_4_;
              }
              auVar225 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_)
              ;
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar201 = auVar75._0_4_ * 6.0;
              fVar173 = local_5a0._0_4_ * 6.0;
              auVar209._0_4_ = fVar173 * (float)local_6a0._0_4_;
              auVar209._4_4_ = fVar173 * (float)local_6a0._4_4_;
              auVar209._8_4_ = fVar173 * fStack_698;
              auVar209._12_4_ = fVar173 * fStack_694;
              auVar190._4_4_ = fVar201;
              auVar190._0_4_ = fVar201;
              auVar190._8_4_ = fVar201;
              auVar190._12_4_ = fVar201;
              auVar75 = vfmadd132ps_fma(auVar190,auVar209,local_660._0_16_);
              fVar201 = auVar225._0_4_ * 6.0;
              auVar162._4_4_ = fVar201;
              auVar162._0_4_ = fVar201;
              auVar162._8_4_ = fVar201;
              auVar162._12_4_ = fVar201;
              auVar75 = vfmadd132ps_fma(auVar162,auVar75,local_680._0_16_);
              fVar201 = local_580._0_4_ * 6.0;
              auVar191._4_4_ = fVar201;
              auVar191._0_4_ = fVar201;
              auVar191._8_4_ = fVar201;
              auVar191._12_4_ = fVar201;
              auVar75 = vfmadd132ps_fma(auVar191,auVar75,local_640._0_16_);
              auVar163._0_4_ = auVar75._0_4_ * (float)local_5c0._0_4_;
              auVar163._4_4_ = auVar75._4_4_ * (float)local_5c0._0_4_;
              auVar163._8_4_ = auVar75._8_4_ * (float)local_5c0._0_4_;
              auVar163._12_4_ = auVar75._12_4_ * (float)local_5c0._0_4_;
              auVar75 = vdpps_avx(auVar76,auVar75,0x7f);
              fVar201 = auVar75._0_4_;
              auVar192._0_4_ = auVar76._0_4_ * fVar201;
              auVar192._4_4_ = auVar76._4_4_ * fVar201;
              auVar192._8_4_ = auVar76._8_4_ * fVar201;
              auVar192._12_4_ = auVar76._12_4_ * fVar201;
              auVar75 = vsubps_avx(auVar163,auVar192);
              fVar201 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar225 = vmaxss_avx(ZEXT416((uint)fVar155),
                                    ZEXT416((uint)(local_780._0_4_ * fVar168 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar76,auVar25);
              auVar193._0_4_ = auVar75._0_4_ * fVar201 * fVar170;
              auVar193._4_4_ = auVar75._4_4_ * fVar201 * fVar170;
              auVar193._8_4_ = auVar75._8_4_ * fVar201 * fVar170;
              auVar193._12_4_ = auVar75._12_4_ * fVar201 * fVar170;
              auVar75 = vdpps_avx(auVar80,auVar248,0x7f);
              auVar234 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar155),auVar225);
              auVar74 = vdpps_avx(auVar71,auVar193,0x7f);
              vfmadd213ss_avx512f(auVar72,ZEXT416((uint)(fVar155 / fVar171)),auVar234);
              fVar170 = auVar75._0_4_ + auVar74._0_4_;
              auVar74 = vdpps_avx(local_7b0,auVar248,0x7f);
              auVar75 = vdpps_avx(auVar71,auVar80,0x7f);
              auVar72 = vmulss_avx512f(auVar79,auVar77);
              auVar77 = vmulss_avx512f(auVar77,auVar77);
              auVar78 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar72._0_4_ * auVar77._0_4_)));
              auVar77 = vdpps_avx(auVar71,local_7b0,0x7f);
              auVar79 = vfnmadd231ss_avx512f(auVar75,local_7e0._0_16_,ZEXT416((uint)fVar170));
              auVar77 = vfnmadd231ss_avx512f(auVar77,local_7e0._0_16_,auVar74);
              auVar75 = vpermilps_avx(local_560._0_16_,0xff);
              fVar172 = fVar172 - auVar75._0_4_;
              auVar72 = vshufps_avx(auVar76,auVar76,0xff);
              auVar75 = vfmsub213ss_fma(auVar79,auVar78,auVar72);
              auVar239._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar239._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar239._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar77 = ZEXT416((uint)(auVar77._0_4_ * auVar78._0_4_));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)),
                                        ZEXT416((uint)fVar170),auVar77);
              auVar75 = vinsertps_avx(auVar239,auVar77,0x1c);
              auVar229._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar229._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar229._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar77 = vinsertps_avx(ZEXT416((uint)fVar170),auVar229,0x10);
              auVar210._0_4_ = auVar78._0_4_;
              auVar210._4_4_ = auVar210._0_4_;
              auVar210._8_4_ = auVar210._0_4_;
              auVar210._12_4_ = auVar210._0_4_;
              auVar74 = vdivps_avx(auVar75,auVar210);
              auVar75 = vdivps_avx(auVar77,auVar210);
              auVar77 = vbroadcastss_avx512vl(local_7e0._0_16_);
              auVar211._0_4_ = auVar77._0_4_ * auVar74._0_4_ + fVar172 * auVar75._0_4_;
              auVar211._4_4_ = auVar77._4_4_ * auVar74._4_4_ + fVar172 * auVar75._4_4_;
              auVar211._8_4_ = auVar77._8_4_ * auVar74._8_4_ + fVar172 * auVar75._8_4_;
              auVar211._12_4_ = auVar77._12_4_ * auVar74._12_4_ + fVar172 * auVar75._12_4_;
              auVar74 = vsubps_avx(local_780._0_16_,auVar211);
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(local_7e0._0_16_,auVar26);
              auVar75 = vucomiss_avx512f(auVar75);
              if (!(bool)uVar66 && !(bool)uVar68) {
                auVar75 = vaddss_avx512f(auVar225,auVar75);
                auVar75 = vfmadd231ss_fma(auVar75,local_710,ZEXT416(0x36000000));
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(ZEXT416((uint)fVar172),auVar27);
                if (auVar77._0_4_ < auVar75._0_4_) {
                  fVar168 = auVar74._0_4_ + (float)local_720._0_4_;
                  auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar202 <= fVar168) {
                    fVar170 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar170 < fVar168) {
                      bVar64 = 0;
                      goto LAB_01d4fbc2;
                    }
                    auVar75 = vmovshdup_avx(auVar74);
                    bVar64 = 0;
                    if ((auVar75._0_4_ < 0.0) || (1.0 < auVar75._0_4_)) goto LAB_01d4fbc2;
                    auVar212._0_12_ = ZEXT812(0);
                    auVar212._12_4_ = 0;
                    auVar194._4_8_ = auVar212._4_8_;
                    auVar194._0_4_ = fVar169;
                    auVar194._12_4_ = 0;
                    auVar75 = vrsqrt14ss_avx512f(auVar212,auVar194);
                    fVar172 = auVar75._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar65].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar64 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01d4fbc2;
                      fVar169 = fVar172 * 1.5 + fVar169 * -0.5 * fVar172 * fVar172 * fVar172;
                      auVar195._0_4_ = auVar71._0_4_ * fVar169;
                      auVar195._4_4_ = auVar71._4_4_ * fVar169;
                      auVar195._8_4_ = auVar71._8_4_ * fVar169;
                      auVar195._12_4_ = auVar71._12_4_ * fVar169;
                      auVar77 = vfmadd213ps_fma(auVar72,auVar195,auVar76);
                      auVar75 = vshufps_avx(auVar195,auVar195,0xc9);
                      auVar71 = vshufps_avx(auVar76,auVar76,0xc9);
                      auVar196._0_4_ = auVar195._0_4_ * auVar71._0_4_;
                      auVar196._4_4_ = auVar195._4_4_ * auVar71._4_4_;
                      auVar196._8_4_ = auVar195._8_4_ * auVar71._8_4_;
                      auVar196._12_4_ = auVar195._12_4_ * auVar71._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar196,auVar76,auVar75);
                      auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                      auVar71 = vshufps_avx(auVar77,auVar77,0xc9);
                      auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                      auVar148._0_4_ = auVar77._0_4_ * auVar76._0_4_;
                      auVar148._4_4_ = auVar77._4_4_ * auVar76._4_4_;
                      auVar148._8_4_ = auVar77._8_4_ * auVar76._8_4_;
                      auVar148._12_4_ = auVar77._12_4_ * auVar76._12_4_;
                      auVar75 = vfmsub231ps_fma(auVar148,auVar75,auVar71);
                      auVar215._8_4_ = 1;
                      auVar215._0_8_ = 0x100000001;
                      auVar215._12_4_ = 1;
                      auVar215._16_4_ = 1;
                      auVar215._20_4_ = 1;
                      auVar215._24_4_ = 1;
                      auVar215._28_4_ = 1;
                      local_3e0 = vpermps_avx2(auVar215,ZEXT1632(auVar74));
                      auVar81 = vpermps_avx2(auVar215,ZEXT1632(auVar75));
                      auVar223._8_4_ = 2;
                      auVar223._0_8_ = 0x200000002;
                      auVar223._12_4_ = 2;
                      auVar223._16_4_ = 2;
                      auVar223._20_4_ = 2;
                      auVar223._24_4_ = 2;
                      auVar223._28_4_ = 2;
                      local_420 = vpermps_avx2(auVar223,ZEXT1632(auVar75));
                      local_400 = auVar75._0_4_;
                      local_440[0] = (RTCHitN)auVar81[0];
                      local_440[1] = (RTCHitN)auVar81[1];
                      local_440[2] = (RTCHitN)auVar81[2];
                      local_440[3] = (RTCHitN)auVar81[3];
                      local_440[4] = (RTCHitN)auVar81[4];
                      local_440[5] = (RTCHitN)auVar81[5];
                      local_440[6] = (RTCHitN)auVar81[6];
                      local_440[7] = (RTCHitN)auVar81[7];
                      local_440[8] = (RTCHitN)auVar81[8];
                      local_440[9] = (RTCHitN)auVar81[9];
                      local_440[10] = (RTCHitN)auVar81[10];
                      local_440[0xb] = (RTCHitN)auVar81[0xb];
                      local_440[0xc] = (RTCHitN)auVar81[0xc];
                      local_440[0xd] = (RTCHitN)auVar81[0xd];
                      local_440[0xe] = (RTCHitN)auVar81[0xe];
                      local_440[0xf] = (RTCHitN)auVar81[0xf];
                      local_440[0x10] = (RTCHitN)auVar81[0x10];
                      local_440[0x11] = (RTCHitN)auVar81[0x11];
                      local_440[0x12] = (RTCHitN)auVar81[0x12];
                      local_440[0x13] = (RTCHitN)auVar81[0x13];
                      local_440[0x14] = (RTCHitN)auVar81[0x14];
                      local_440[0x15] = (RTCHitN)auVar81[0x15];
                      local_440[0x16] = (RTCHitN)auVar81[0x16];
                      local_440[0x17] = (RTCHitN)auVar81[0x17];
                      local_440[0x18] = (RTCHitN)auVar81[0x18];
                      local_440[0x19] = (RTCHitN)auVar81[0x19];
                      local_440[0x1a] = (RTCHitN)auVar81[0x1a];
                      local_440[0x1b] = (RTCHitN)auVar81[0x1b];
                      local_440[0x1c] = (RTCHitN)auVar81[0x1c];
                      local_440[0x1d] = (RTCHitN)auVar81[0x1d];
                      local_440[0x1e] = (RTCHitN)auVar81[0x1e];
                      local_440[0x1f] = (RTCHitN)auVar81[0x1f];
                      uStack_3fc = local_400;
                      uStack_3f8 = local_400;
                      uStack_3f4 = local_400;
                      uStack_3f0 = local_400;
                      uStack_3ec = local_400;
                      uStack_3e8 = local_400;
                      uStack_3e4 = local_400;
                      local_3c0 = ZEXT432(0) << 0x20;
                      local_3a0 = local_460._0_8_;
                      uStack_398 = local_460._8_8_;
                      uStack_390 = local_460._16_8_;
                      uStack_388 = local_460._24_8_;
                      local_380 = local_480;
                      vpcmpeqd_avx2(local_480,local_480);
                      local_360 = context->user->instID[0];
                      uStack_35c = local_360;
                      uStack_358 = local_360;
                      uStack_354 = local_360;
                      uStack_350 = local_360;
                      uStack_34c = local_360;
                      uStack_348 = local_360;
                      uStack_344 = local_360;
                      local_340 = context->user->instPrimID[0];
                      uStack_33c = local_340;
                      uStack_338 = local_340;
                      uStack_334 = local_340;
                      uStack_330 = local_340;
                      uStack_32c = local_340;
                      uStack_328 = local_340;
                      uStack_324 = local_340;
                      *(float *)(ray + k * 4 + 0x100) = fVar168;
                      local_760 = local_4c0;
                      local_810.valid = (int *)local_760;
                      local_810.geometryUserPtr = pGVar2->userPtr;
                      local_810.context = context->user;
                      local_810.hit = local_440;
                      local_810.N = 8;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar2->occlusionFilterN)(&local_810);
                        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      }
                      if (local_760 != (undefined1  [32])0x0) {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var3)(&local_810);
                          auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        }
                        uVar69 = vptestmd_avx512vl(local_760,local_760);
                        auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar4 = (bool)((byte)uVar69 & 1);
                        bVar5 = (bool)((byte)(uVar69 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar69 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar69 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar69 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar69 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar69 >> 6) & 1);
                        bVar11 = SUB81(uVar69 >> 7,0);
                        *(uint *)(local_810.ray + 0x100) =
                             (uint)bVar4 * auVar81._0_4_ |
                             (uint)!bVar4 * *(int *)(local_810.ray + 0x100);
                        *(uint *)(local_810.ray + 0x104) =
                             (uint)bVar5 * auVar81._4_4_ |
                             (uint)!bVar5 * *(int *)(local_810.ray + 0x104);
                        *(uint *)(local_810.ray + 0x108) =
                             (uint)bVar6 * auVar81._8_4_ |
                             (uint)!bVar6 * *(int *)(local_810.ray + 0x108);
                        *(uint *)(local_810.ray + 0x10c) =
                             (uint)bVar7 * auVar81._12_4_ |
                             (uint)!bVar7 * *(int *)(local_810.ray + 0x10c);
                        *(uint *)(local_810.ray + 0x110) =
                             (uint)bVar8 * auVar81._16_4_ |
                             (uint)!bVar8 * *(int *)(local_810.ray + 0x110);
                        *(uint *)(local_810.ray + 0x114) =
                             (uint)bVar9 * auVar81._20_4_ |
                             (uint)!bVar9 * *(int *)(local_810.ray + 0x114);
                        *(uint *)(local_810.ray + 0x118) =
                             (uint)bVar10 * auVar81._24_4_ |
                             (uint)!bVar10 * *(int *)(local_810.ray + 0x118);
                        *(uint *)(local_810.ray + 0x11c) =
                             (uint)bVar11 * auVar81._28_4_ |
                             (uint)!bVar11 * *(int *)(local_810.ray + 0x11c);
                        bVar64 = 1;
                        if (local_760 != (undefined1  [32])0x0) goto LAB_01d4fbc2;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar170;
                      bVar64 = 0;
                      goto LAB_01d4fbc2;
                    }
                  }
                  bVar64 = 0;
                  goto LAB_01d4fbc2;
                }
              }
              bVar67 = uVar69 < 4;
              uVar69 = uVar69 + 1;
            } while (uVar69 != 5);
            bVar67 = false;
            auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar64 = 5;
LAB_01d4fbc2:
            bVar63 = (bool)(bVar63 | bVar67 & bVar64);
            uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar152._4_4_ = uVar156;
            auVar152._0_4_ = uVar156;
            auVar152._8_4_ = uVar156;
            auVar152._12_4_ = uVar156;
            auVar152._16_4_ = uVar156;
            auVar152._20_4_ = uVar156;
            auVar152._24_4_ = uVar156;
            auVar152._28_4_ = uVar156;
            auVar49._4_4_ = fStack_4dc;
            auVar49._0_4_ = local_4e0;
            auVar49._8_4_ = fStack_4d8;
            auVar49._12_4_ = fStack_4d4;
            auVar49._16_4_ = fStack_4d0;
            auVar49._20_4_ = fStack_4cc;
            auVar49._24_4_ = fStack_4c8;
            auVar49._28_4_ = fStack_4c4;
            uVar14 = vcmpps_avx512vl(auVar152,auVar49,0xd);
            bVar54 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar54 & (byte)uVar14;
            auVar132 = local_500;
          } while (bVar54 != 0);
        }
        auVar224 = ZEXT3264(local_6c0);
        uVar15 = vpcmpgtd_avx512vl(auVar132,local_4a0);
        uVar16 = vpcmpd_avx512vl(local_4a0,local_2c0,1);
        auVar199._0_4_ = fVar141 + (float)local_1c0._0_4_;
        auVar199._4_4_ = fVar141 + (float)local_1c0._4_4_;
        auVar199._8_4_ = fVar141 + fStack_1b8;
        auVar199._12_4_ = fVar141 + fStack_1b4;
        auVar199._16_4_ = fVar141 + fStack_1b0;
        auVar199._20_4_ = fVar141 + fStack_1ac;
        auVar199._24_4_ = fVar141 + fStack_1a8;
        auVar199._28_4_ = fVar141 + fStack_1a4;
        uVar14 = vcmpps_avx512vl(auVar199,auVar152,2);
        bVar57 = bVar57 & (byte)uVar16 & (byte)uVar14;
        auVar200._0_4_ = fVar141 + local_320._0_4_;
        auVar200._4_4_ = fVar141 + local_320._4_4_;
        auVar200._8_4_ = fVar141 + local_320._8_4_;
        auVar200._12_4_ = fVar141 + local_320._12_4_;
        auVar200._16_4_ = fVar141 + local_320._16_4_;
        auVar200._20_4_ = fVar141 + local_320._20_4_;
        auVar200._24_4_ = fVar141 + local_320._24_4_;
        auVar200._28_4_ = fVar141 + local_320._28_4_;
        uVar14 = vcmpps_avx512vl(auVar200,auVar152,2);
        bVar52 = bVar52 & (byte)uVar15 & (byte)uVar14 | bVar57;
        prim = local_6d0;
        if (bVar52 != 0) {
          uVar62 = (ulong)uVar60;
          abStack_180[uVar62 * 0x60] = bVar52;
          auVar134._0_4_ =
               (uint)(bVar57 & 1) * local_1c0._0_4_ |
               (uint)!(bool)(bVar57 & 1) * (int)local_320._0_4_;
          bVar67 = (bool)(bVar57 >> 1 & 1);
          auVar134._4_4_ = (uint)bVar67 * local_1c0._4_4_ | (uint)!bVar67 * (int)local_320._4_4_;
          bVar67 = (bool)(bVar57 >> 2 & 1);
          auVar134._8_4_ = (uint)bVar67 * (int)fStack_1b8 | (uint)!bVar67 * (int)local_320._8_4_;
          bVar67 = (bool)(bVar57 >> 3 & 1);
          auVar134._12_4_ = (uint)bVar67 * (int)fStack_1b4 | (uint)!bVar67 * (int)local_320._12_4_;
          bVar67 = (bool)(bVar57 >> 4 & 1);
          auVar134._16_4_ = (uint)bVar67 * (int)fStack_1b0 | (uint)!bVar67 * (int)local_320._16_4_;
          bVar67 = (bool)(bVar57 >> 5 & 1);
          auVar134._20_4_ = (uint)bVar67 * (int)fStack_1ac | (uint)!bVar67 * (int)local_320._20_4_;
          auVar134._24_4_ =
               (uint)(bVar57 >> 6) * (int)fStack_1a8 |
               (uint)!(bool)(bVar57 >> 6) * (int)local_320._24_4_;
          auVar134._28_4_ = local_320._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar62 * 0x60) = auVar134;
          uVar69 = vmovlps_avx(local_730);
          (&uStack_140)[uVar62 * 0xc] = uVar69;
          aiStack_138[uVar62 * 0x18] = local_ad8 + 1;
          uVar60 = uVar60 + 1;
        }
      }
    }
    do {
      uVar70 = uVar60;
      uVar61 = uVar70 - 1;
      if (uVar70 == 0) {
        if (bVar63 != false) {
          return bVar63;
        }
        uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar33._4_4_ = uVar156;
        auVar33._0_4_ = uVar156;
        auVar33._8_4_ = uVar156;
        auVar33._12_4_ = uVar156;
        auVar33._16_4_ = uVar156;
        auVar33._20_4_ = uVar156;
        auVar33._24_4_ = uVar156;
        auVar33._28_4_ = uVar156;
        uVar14 = vcmpps_avx512vl(local_2a0,auVar33,2);
        uVar65 = (uint)local_6c8 & (uint)uVar14;
        local_6c8 = (ulong)uVar65;
        if (uVar65 == 0) {
          return false;
        }
        goto LAB_01d4d8bd;
      }
      uVar69 = (ulong)uVar61;
      lVar59 = uVar69 * 0x60;
      auVar81 = *(undefined1 (*) [32])(auStack_160 + lVar59);
      auVar164._0_4_ = fVar141 + auVar81._0_4_;
      auVar164._4_4_ = fVar141 + auVar81._4_4_;
      auVar164._8_4_ = fVar141 + auVar81._8_4_;
      auVar164._12_4_ = fVar141 + auVar81._12_4_;
      auVar164._16_4_ = fVar141 + auVar81._16_4_;
      auVar164._20_4_ = fVar141 + auVar81._20_4_;
      auVar164._24_4_ = fVar141 + auVar81._24_4_;
      auVar164._28_4_ = fVar141 + auVar81._28_4_;
      uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar32._4_4_ = uVar156;
      auVar32._0_4_ = uVar156;
      auVar32._8_4_ = uVar156;
      auVar32._12_4_ = uVar156;
      auVar32._16_4_ = uVar156;
      auVar32._20_4_ = uVar156;
      auVar32._24_4_ = uVar156;
      auVar32._28_4_ = uVar156;
      uVar14 = vcmpps_avx512vl(auVar164,auVar32,2);
      uVar56 = (uint)uVar14 & (uint)abStack_180[lVar59];
      uVar60 = uVar61;
    } while (uVar56 == 0);
    uVar62 = (&uStack_140)[uVar69 * 0xc];
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar62;
    auVar198._8_4_ = 0x7f800000;
    auVar198._0_8_ = 0x7f8000007f800000;
    auVar198._12_4_ = 0x7f800000;
    auVar198._16_4_ = 0x7f800000;
    auVar198._20_4_ = 0x7f800000;
    auVar198._24_4_ = 0x7f800000;
    auVar198._28_4_ = 0x7f800000;
    auVar82 = vblendmps_avx512vl(auVar198,auVar81);
    bVar52 = (byte)uVar56;
    auVar130._0_4_ =
         (uint)(bVar52 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar52 & 1) * (int)auVar81._0_4_;
    bVar67 = (bool)((byte)(uVar56 >> 1) & 1);
    auVar130._4_4_ = (uint)bVar67 * auVar82._4_4_ | (uint)!bVar67 * (int)auVar81._4_4_;
    bVar67 = (bool)((byte)(uVar56 >> 2) & 1);
    auVar130._8_4_ = (uint)bVar67 * auVar82._8_4_ | (uint)!bVar67 * (int)auVar81._8_4_;
    bVar67 = (bool)((byte)(uVar56 >> 3) & 1);
    auVar130._12_4_ = (uint)bVar67 * auVar82._12_4_ | (uint)!bVar67 * (int)auVar81._12_4_;
    bVar67 = (bool)((byte)(uVar56 >> 4) & 1);
    auVar130._16_4_ = (uint)bVar67 * auVar82._16_4_ | (uint)!bVar67 * (int)auVar81._16_4_;
    bVar67 = (bool)((byte)(uVar56 >> 5) & 1);
    auVar130._20_4_ = (uint)bVar67 * auVar82._20_4_ | (uint)!bVar67 * (int)auVar81._20_4_;
    bVar67 = (bool)((byte)(uVar56 >> 6) & 1);
    auVar130._24_4_ = (uint)bVar67 * auVar82._24_4_ | (uint)!bVar67 * (int)auVar81._24_4_;
    auVar130._28_4_ =
         (uVar56 >> 7) * auVar82._28_4_ | (uint)!SUB41(uVar56 >> 7,0) * (int)auVar81._28_4_;
    auVar81 = vshufps_avx(auVar130,auVar130,0xb1);
    auVar81 = vminps_avx(auVar130,auVar81);
    auVar82 = vshufpd_avx(auVar81,auVar81,5);
    auVar81 = vminps_avx(auVar81,auVar82);
    auVar82 = vpermpd_avx2(auVar81,0x4e);
    auVar81 = vminps_avx(auVar81,auVar82);
    uVar14 = vcmpps_avx512vl(auVar130,auVar81,0);
    bVar54 = (byte)uVar14 & bVar52;
    if (bVar54 != 0) {
      uVar56 = (uint)bVar54;
    }
    uVar135 = 0;
    for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
      uVar135 = uVar135 + 1;
    }
    local_ad8 = aiStack_138[uVar69 * 0x18];
    bVar52 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar52;
    abStack_180[lVar59] = bVar52;
    uVar60 = uVar70;
    if (bVar52 == 0) {
      uVar60 = uVar61;
    }
    uVar156 = (undefined4)uVar62;
    auVar149._4_4_ = uVar156;
    auVar149._0_4_ = uVar156;
    auVar149._8_4_ = uVar156;
    auVar149._12_4_ = uVar156;
    auVar149._16_4_ = uVar156;
    auVar149._20_4_ = uVar156;
    auVar149._24_4_ = uVar156;
    auVar149._28_4_ = uVar156;
    auVar74 = vmovshdup_avx(auVar157);
    auVar74 = vsubps_avx(auVar74,auVar157);
    auVar165._0_4_ = auVar74._0_4_;
    auVar165._4_4_ = auVar165._0_4_;
    auVar165._8_4_ = auVar165._0_4_;
    auVar165._12_4_ = auVar165._0_4_;
    auVar165._16_4_ = auVar165._0_4_;
    auVar165._20_4_ = auVar165._0_4_;
    auVar165._24_4_ = auVar165._0_4_;
    auVar165._28_4_ = auVar165._0_4_;
    auVar74 = vfmadd132ps_fma(auVar165,auVar149,_DAT_01faff20);
    auVar81 = ZEXT1632(auVar74);
    local_440[0] = (RTCHitN)auVar81[0];
    local_440[1] = (RTCHitN)auVar81[1];
    local_440[2] = (RTCHitN)auVar81[2];
    local_440[3] = (RTCHitN)auVar81[3];
    local_440[4] = (RTCHitN)auVar81[4];
    local_440[5] = (RTCHitN)auVar81[5];
    local_440[6] = (RTCHitN)auVar81[6];
    local_440[7] = (RTCHitN)auVar81[7];
    local_440[8] = (RTCHitN)auVar81[8];
    local_440[9] = (RTCHitN)auVar81[9];
    local_440[10] = (RTCHitN)auVar81[10];
    local_440[0xb] = (RTCHitN)auVar81[0xb];
    local_440[0xc] = (RTCHitN)auVar81[0xc];
    local_440[0xd] = (RTCHitN)auVar81[0xd];
    local_440[0xe] = (RTCHitN)auVar81[0xe];
    local_440[0xf] = (RTCHitN)auVar81[0xf];
    local_440[0x10] = (RTCHitN)auVar81[0x10];
    local_440[0x11] = (RTCHitN)auVar81[0x11];
    local_440[0x12] = (RTCHitN)auVar81[0x12];
    local_440[0x13] = (RTCHitN)auVar81[0x13];
    local_440[0x14] = (RTCHitN)auVar81[0x14];
    local_440[0x15] = (RTCHitN)auVar81[0x15];
    local_440[0x16] = (RTCHitN)auVar81[0x16];
    local_440[0x17] = (RTCHitN)auVar81[0x17];
    local_440[0x18] = (RTCHitN)auVar81[0x18];
    local_440[0x19] = (RTCHitN)auVar81[0x19];
    local_440[0x1a] = (RTCHitN)auVar81[0x1a];
    local_440[0x1b] = (RTCHitN)auVar81[0x1b];
    local_440[0x1c] = (RTCHitN)auVar81[0x1c];
    local_440[0x1d] = (RTCHitN)auVar81[0x1d];
    local_440[0x1e] = (RTCHitN)auVar81[0x1e];
    local_440[0x1f] = (RTCHitN)auVar81[0x1f];
    local_730._8_8_ = 0;
    local_730._0_8_ = *(ulong *)(local_440 + (ulong)uVar135 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }